

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamIGA::ComputeInternalForces_impl
          (ChElementBeamIGA *this,ChVectorDynamic<> *Fi,ChState *state_x,ChStateDelta *state_w,
          bool used_for_differentiation)

{
  long *plVar1;
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [16];
  int iVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  double *pdVar9;
  byte bVar10;
  bool bVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  ChVectorDynamic<> *pCVar27;
  long lVar28;
  ChQuadratureTables *pCVar29;
  pointer psVar30;
  undefined1 (*pauVar31) [64];
  pointer psVar32;
  long lVar33;
  ChVector<double> *pCVar34;
  pointer pCVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  _Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false> _Var40;
  element_type *peVar41;
  ulong uVar42;
  double *pdVar43;
  undefined7 in_register_00000081;
  _Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false> _Var44;
  Index index;
  long lVar45;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var46;
  double dVar47;
  long lVar48;
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar55 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  double dVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 extraout_var [56];
  double dVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  double dVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  double dVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  double dVar156;
  double dVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  double dVar233;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 in_ZMM18 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  ChMatrixDynamic<> N;
  ChQuaternion<double> q_i;
  ChVector<double> r_i;
  ChVector<double> wl_i;
  ChMatrix33<double> R;
  ChQuaternion<double> qR;
  ChVector<double> astrain_k;
  ChVector<double> wl_i_1;
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  foo_plastic_data;
  ChVector<double> Force_i;
  double local_330;
  double local_320;
  double local_318;
  double dStack_310;
  double local_300;
  undefined1 local_2f8 [16];
  long local_2e8;
  double local_2e0;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  ChQuaternion<double> local_2b8;
  long lStack_298;
  double dStack_290;
  long lStack_288;
  long lStack_280;
  ChQuaternion<double> local_278;
  double local_250;
  double local_248;
  double local_240;
  ChVector<double> local_238;
  ChMatrix33<double> local_218;
  undefined4 local_1cc;
  ChQuaternion<double> local_1c8;
  ChVectorDynamic<> *local_1a0;
  double local_198;
  ChStateDelta *local_190;
  ChVector<double> local_188;
  ChVector<double> local_168;
  double local_148;
  double dStack_140;
  double local_138;
  undefined8 uStack_130;
  ChVectorDynamic<> *local_120;
  double local_118;
  ChVector<double> local_110;
  undefined1 local_f8 [8];
  undefined1 auStack_f0 [16];
  double dStack_e0;
  ChVector<double> local_b8;
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  local_98;
  double local_80 [4];
  long lStack_60;
  long lStack_58;
  long lStack_50;
  undefined1 auStack_48 [16];
  undefined8 local_38;
  
  auVar54 = in_ZMM18._0_16_;
  lVar28 = (long)this->order;
  local_1cc = (undefined4)CONCAT71(in_register_00000081,used_for_differentiation);
  local_190 = state_w;
  if ((-1 < lVar28) &&
     (uVar39 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows, lVar28 < (long)uVar39)) {
    uVar38 = (ulong)~this->order;
    lVar33 = uVar39 + uVar38;
    if ((-1 < lVar33) && (CARRY8(uVar39,uVar38))) {
      lVar45 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      local_120 = &this->knots;
      if (lVar45 < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      pdVar43 = (local_120->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_data;
      dVar47 = pdVar43[lVar28];
      dVar127 = pdVar43[lVar33];
      if (lVar45 != 0) {
        memset((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               ,0,lVar45 << 3);
      }
      local_198 = (dVar127 - dVar47) * 0.5;
      local_118 = (dVar47 + dVar127) * 0.5;
      local_1a0 = Fi;
      if (this->int_order_b < 1) {
        bVar11 = false;
      }
      else {
        dVar47 = 0.0;
        do {
          pCVar29 = ChQuadrature::GetStaticTables();
          auVar50._8_8_ = 0;
          auVar50._0_8_ = local_118;
          auVar51._8_8_ = 0;
          auVar51._0_8_ =
               *(ulong *)(*(long *)&(pCVar29->Lroots).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [(long)this->int_order_b + -1].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + (long)dVar47 * 8);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = local_198;
          auVar54 = vfmadd132sd_fma(auVar51,auVar50,auVar54);
          pCVar29 = ChQuadrature::GetStaticTables();
          iVar4 = this->order;
          lStack_58 = *(long *)(*(long *)&(pCVar29->Weight).
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start
                                          [(long)this->int_order_b + -1].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl + (long)dVar47 * 8);
          lStack_50 = 0;
          local_248 = (this->Jacobian_b).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start[(long)dVar47];
          local_2e8 = 0;
          lVar28 = (long)(int)((ulong)((long)(this->nodes).
                                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4);
          local_2f8 = ZEXT816(0) << 0x20;
          local_250 = dVar47;
          if (lVar28 < 0) goto LAB_0068cc7c;
          Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                    ((DenseStorage<double,__1,__1,__1,_1> *)local_2f8,lVar28 * 2,2,lVar28);
          geometry::ChBasisToolsBspline::BasisEvaluateDeriv
                    (this->order,iVar4,auVar54._0_8_,local_120,(ChMatrixDynamic<> *)local_2f8);
          psVar30 = (this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_330 = VNULL;
          local_318 = DAT_00b689a0;
          local_320 = DAT_00b689a8;
          if ((this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != psVar30) {
            lVar28 = 0x18;
            dVar47 = 1.48219693752374e-323;
            uVar39 = 0;
            do {
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
                   = (double)(state_x->super_ChVectorDynamic<double>).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows;
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
                   = (double)((long)(state_x->super_ChVectorDynamic<double>).
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_data + lVar28);
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
                   = 1.97626258336499e-323;
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
                   = (double)state_x;
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
                   = dVar47;
              if ((long)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[6] - 4U) < (long)dVar47) goto LAB_0068cc5a;
              ChQuaternion<double>::
              ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                        (&local_2b8,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_218,(type *)0x0);
              auVar204._8_8_ = 0;
              auVar204._0_8_ = local_2b8.m_data[0];
              auVar212._8_8_ = 0;
              auVar212._0_8_ = local_2b8.m_data[2];
              auVar242._8_8_ = 0;
              auVar242._0_8_ = local_2b8.m_data[1];
              auVar53._8_8_ = 0;
              auVar53._0_8_ = local_2b8.m_data[3];
              dVar49 = 1.0;
              dVar98 = 0.0;
              dVar233 = 0.0;
              dVar74 = 0.0;
              peVar5 = (((this->nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
              auVar193._8_8_ = 0;
              auVar193._0_8_ = *(double *)&peVar5->field_0x48;
              dVar127 = *(double *)&peVar5->field_0x40;
              auVar222._8_8_ = 0;
              auVar222._0_8_ = dVar127;
              auVar178._8_8_ = 0;
              auVar178._0_8_ = *(ulong *)&peVar5->field_0x38;
              auVar158._8_8_ = 0;
              auVar158._0_8_ = *(double *)&peVar5->field_0x50;
              auVar263._8_8_ = 0;
              auVar263._0_8_ = local_2b8.m_data[0] * *(double *)&peVar5->field_0x48;
              auVar54 = vfmsub231sd_fma(auVar263,auVar178,auVar212);
              auVar52._8_8_ = 0;
              auVar52._0_8_ = dVar127 * local_2b8.m_data[0];
              auVar50 = vfmsub231sd_fma(auVar52,auVar178,auVar242);
              auVar268._8_8_ = 0;
              auVar268._0_8_ = local_2b8.m_data[0] * *(double *)&peVar5->field_0x50;
              auVar51 = vfmsub231sd_fma(auVar268,auVar178,auVar53);
              auVar52 = vfnmadd231sd_fma(auVar54,auVar158,auVar242);
              auVar54 = vfmadd231sd_fma(auVar50,auVar158,auVar212);
              auVar50 = vfmadd231sd_fma(auVar51,auVar193,auVar242);
              auVar51 = vfmadd231sd_fma(auVar52,auVar222,auVar53);
              auVar52 = vfnmadd231sd_fma(auVar54,auVar193,auVar53);
              auVar50 = vfnmadd231sd_fma(auVar50,auVar222,auVar212);
              dVar157 = auVar51._0_8_;
              auVar250._8_8_ = 0;
              auVar250._0_8_ = dVar157 * dVar157;
              auVar54 = vfmadd231sd_fma(auVar250,auVar52,auVar52);
              auVar54 = vfmadd231sd_fma(auVar54,auVar50,auVar50);
              if (0.0 < auVar54._0_8_) {
                local_f8 = (undefined1  [8])auVar52._0_8_;
                local_2d8._0_8_ = dVar157;
                local_2c8._0_8_ = auVar50._0_8_;
                auVar75._8_8_ = 0;
                auVar75._0_8_ = dVar127 * local_2b8.m_data[1];
                auVar50 = vfmadd213sd_fma(auVar204,auVar178,auVar75);
                auVar54 = vsqrtsd_avx(auVar54,auVar54);
                auVar50 = vfmadd213sd_fma(auVar212,auVar193,auVar50);
                auVar50 = vfmadd213sd_fma(auVar53,auVar158,auVar50);
                dVar74 = atan2(auVar54._0_8_,auVar50._0_8_);
                dVar74 = dVar74 + dVar74;
                dVar98 = 1.0 / auVar54._0_8_;
                dVar127 = dVar98 * (double)local_2d8._0_8_;
                auVar128._8_8_ = 0;
                auVar128._0_8_ = dVar98 * (double)local_f8;
                auVar159._8_8_ = 0;
                auVar159._0_8_ = dVar127 * dVar127;
                auVar54 = vfmadd231sd_fma(auVar159,auVar128,auVar128);
                auVar99._8_8_ = 0;
                auVar99._0_8_ = dVar98 * (double)local_2c8._0_8_;
                auVar54 = vfmadd231sd_fma(auVar54,auVar99,auVar99);
                auVar54 = vsqrtsd_avx(auVar54,auVar54);
                dVar156 = 1.0 / auVar54._0_8_;
                bVar11 = 2.2250738585072014e-308 <= auVar54._0_8_;
                dVar233 = (double)((ulong)bVar11 *
                                  (long)(dVar98 * (double)local_2c8._0_8_ * dVar156));
                dVar157 = -6.283185307179586;
                dVar49 = (double)((ulong)bVar11 * (long)(dVar98 * (double)local_f8 * dVar156) +
                                 (ulong)!bVar11 * 0x3ff0000000000000);
                dVar98 = (double)((ulong)bVar11 * (long)(dVar127 * dVar156));
                if ((3.141592653589793 < dVar74) ||
                   (dVar157 = 6.283185307179586, dVar74 < -3.141592653589793)) {
                  dVar74 = dVar74 + dVar157;
                }
              }
              if (((long)local_2f8._8_8_ < 1) || (local_2e8 <= (long)uVar39)) goto LAB_0068cc38;
              lVar28 = lVar28 + 0x38;
              dVar47 = (double)((long)dVar47 + 7);
              dVar127 = *(double *)(local_2f8._0_8_ + uVar39 * 8);
              psVar30 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar39 = uVar39 + 1;
              local_330 = local_330 + dVar49 * dVar74 * dVar127;
              local_318 = local_318 + dVar98 * dVar74 * dVar127;
              local_320 = local_320 + dVar233 * dVar74 * dVar127;
            } while (uVar39 < (ulong)((long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)psVar30 >> 4));
          }
          auVar76._8_8_ = 0;
          auVar76._0_8_ = local_330;
          auVar100._8_8_ = 0;
          auVar100._0_8_ = local_318 * local_318;
          auVar54 = vfmadd231sd_fma(auVar100,auVar76,auVar76);
          auVar77._8_8_ = 0;
          auVar77._0_8_ = local_320;
          auVar54 = vfmadd231sd_fma(auVar54,auVar77,auVar77);
          auVar50 = ZEXT816(0x3ff0000000000000);
          dVar47 = 0.5;
          if (1e-30 < auVar54._0_8_) {
            auVar54 = vsqrtsd_avx(auVar54,auVar54);
            dVar47 = auVar54._0_8_ * 0.5;
            local_2c8._0_8_ = dVar47;
            local_2d8._0_8_ = auVar54._0_8_;
            dVar47 = sin(dVar47);
            local_2d8._0_8_ = dVar47 / (double)local_2d8._0_8_;
            auVar275._0_8_ = cos((double)local_2c8._0_8_);
            auVar275._8_56_ = extraout_var;
            auVar50 = auVar275._0_16_;
            psVar30 = (this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dVar47 = (double)local_2d8._0_8_;
          }
          peVar5 = (psVar30->
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          dVar127 = *(double *)&peVar5->field_0x40;
          auVar179._8_8_ = 0;
          auVar179._0_8_ = dVar127;
          auVar205._8_8_ = 0;
          auVar205._0_8_ = *(double *)&peVar5->field_0x48;
          auVar160._8_8_ = 0;
          auVar160._0_8_ = *(ulong *)&peVar5->field_0x38;
          auVar213._8_8_ = 0;
          auVar213._0_8_ = *(double *)&peVar5->field_0x50;
          dVar74 = auVar50._0_8_;
          auVar194._8_8_ = 0;
          auVar194._0_8_ = dVar47 * local_330 * dVar127;
          auVar52 = vfmsub231sd_fma(auVar194,auVar160,auVar50);
          auVar129._8_8_ = 0;
          auVar129._0_8_ = dVar47 * local_330;
          auVar223._8_8_ = 0;
          auVar223._0_8_ = dVar74 * dVar127;
          auVar54 = vfmadd231sd_fma(auVar223,auVar160,auVar129);
          auVar141._8_8_ = 0;
          auVar141._0_8_ = dVar47 * local_318;
          auVar234._8_8_ = 0;
          auVar234._0_8_ = dVar74 * *(double *)&peVar5->field_0x48;
          auVar50 = vfmadd231sd_fma(auVar234,auVar160,auVar141);
          auVar78._8_8_ = 0;
          auVar78._0_8_ = *(double *)&peVar5->field_0x50 * dVar74;
          auVar101._8_8_ = 0;
          auVar101._0_8_ = dVar47 * local_320;
          auVar51 = vfmadd231sd_fma(auVar78,auVar160,auVar101);
          auVar52 = vfnmadd231sd_fma(auVar52,auVar205,auVar141);
          auVar142._8_8_ = 0;
          auVar142._0_8_ = dVar47 * local_318;
          auVar53 = vfnmadd231sd_fma(auVar54,auVar213,auVar142);
          auVar54 = vfmadd231sd_fma(auVar50,auVar213,auVar129);
          auVar51 = vfnmadd231sd_fma(auVar51,auVar205,auVar129);
          auVar52 = vfnmadd231sd_fma(auVar52,auVar213,auVar101);
          auVar102._8_8_ = 0;
          auVar102._0_8_ = dVar47 * local_320;
          auVar50 = vfmadd231sd_fma(auVar53,auVar205,auVar102);
          auVar53 = vfnmadd231sd_fma(auVar54,auVar179,auVar102);
          auVar54 = vfmadd231sd_fma(auVar51,auVar179,auVar142);
          local_1c8.m_data[0] = auVar52._0_8_;
          local_1c8.m_data[1] = auVar50._0_8_;
          local_1c8.m_data[2] = auVar53._0_8_;
          local_1c8.m_data[3] = auVar54._0_8_;
          ChMatrix33<double>::ChMatrix33(&local_218,&local_1c8);
          psVar30 = (this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (psVar30 ==
              (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_80[3] = 1.0 / local_248;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = local_2d8._8_8_;
            local_2d8 = auVar24 << 0x40;
            lStack_60 = 0;
            local_148 = local_80[3] * 0.0;
            uStack_130 = 0;
            local_2c8 = ZEXT816(0);
            psVar32 = psVar30;
            dStack_140 = local_148;
            local_138 = local_148;
          }
          else {
            lVar28 = 0;
            lVar33 = 0;
            uVar39 = 0;
            local_318 = 0.0;
            dStack_310 = 0.0;
            local_330 = 0.0;
            do {
              lStack_288 = (state_x->super_ChVectorDynamic<double>).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows;
              local_2b8.m_data[0] =
                   (double)((long)(state_x->super_ChVectorDynamic<double>).
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data + lVar33);
              local_2b8.m_data[1] = 1.48219693752374e-323;
              local_2b8.m_data[3] = (double)state_x;
              lStack_298 = lVar28;
              if (lStack_288 + -3 < lVar28) goto LAB_0068cc5a;
              ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                        ((ChVector<double> *)&local_278,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_2b8,(type *)0x0);
              if (((long)local_2f8._8_8_ < 2) || (local_2e8 <= (long)uVar39)) goto LAB_0068cc38;
              psVar32 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              lVar33 = lVar33 + 0x38;
              lVar28 = lVar28 + 7;
              dVar47 = *(double *)(local_2f8._0_8_ + (local_2e8 + uVar39) * 8);
              psVar30 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar39 = uVar39 + 1;
              local_330 = local_330 + dVar47 * local_278.m_data[0];
              local_318 = local_318 + dVar47 * local_278.m_data[1];
              dStack_310 = dStack_310 + dVar47 * local_278.m_data[2];
            } while (uVar39 < (ulong)((long)psVar32 - (long)psVar30 >> 4));
            local_80[3] = 1.0 / local_248;
            local_138 = local_80[3] * local_330;
            lStack_60 = 0;
            uStack_130 = 0;
            local_148 = local_80[3] * local_318;
            dStack_140 = local_80[3] * dStack_310;
            if (psVar32 == psVar30) {
              local_2c8 = ZEXT816(0);
              auVar25._8_8_ = 0;
              auVar25._0_8_ = local_2d8._8_8_;
              local_2d8 = auVar25 << 0x40;
              psVar32 = psVar30;
              Fi = local_1a0;
            }
            else {
              local_2c8 = ZEXT816(0);
              lVar28 = 0;
              lVar33 = 0;
              uVar39 = 0;
              auVar23._8_8_ = 0;
              auVar23._0_8_ = local_2d8._8_8_;
              local_2d8 = auVar23 << 0x40;
              do {
                lStack_288 = (local_190->super_ChVectorDynamic<double>).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows;
                local_2b8.m_data[0] =
                     (double)((long)(local_190->super_ChVectorDynamic<double>).
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_data + lVar33);
                local_2b8.m_data[1] = 1.48219693752374e-323;
                local_2b8.m_data[3] = (double)local_190;
                lStack_298 = lVar28;
                if (lStack_288 + -3 < lVar28) goto LAB_0068cc5a;
                ChVector<double>::
                ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                          ((ChVector<double> *)&local_278,
                           (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                            *)&local_2b8,(type *)0x0);
                if (((long)local_2f8._8_8_ < 2) || (local_2e8 <= (long)uVar39)) goto LAB_0068cc38;
                psVar32 = (this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                lVar33 = lVar33 + 0x30;
                lVar28 = lVar28 + 6;
                dVar47 = *(double *)(local_2f8._0_8_ + (local_2e8 + uVar39) * 8);
                psVar30 = (this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar39 = uVar39 + 1;
                local_2d8._0_8_ = (double)local_2d8._0_8_ + dVar47 * local_278.m_data[0];
                local_2c8._8_8_ = (double)local_2c8._8_8_ + dVar47 * local_278.m_data[2];
                local_2c8._0_8_ = (double)local_2c8._0_8_ + dVar47 * local_278.m_data[1];
                Fi = local_1a0;
              } while (uVar39 < (ulong)((long)psVar32 - (long)psVar30 >> 4));
            }
          }
          local_318 = VNULL;
          local_330 = DAT_00b689a0;
          local_320 = DAT_00b689a8;
          if (psVar32 == psVar30) {
LAB_0068b065:
            dVar127 = 0.0;
            dVar74 = 0.0;
            local_300 = 0.0;
          }
          else {
            lVar33 = 0x18;
            lVar28 = 3;
            uVar39 = 0;
            do {
              lStack_288 = (state_x->super_ChVectorDynamic<double>).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows;
              local_2b8.m_data[0] =
                   (double)((long)(state_x->super_ChVectorDynamic<double>).
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data + lVar33);
              local_2b8.m_data[1] = 1.97626258336499e-323;
              local_2b8.m_data[3] = (double)state_x;
              lStack_298 = lVar28;
              if (lStack_288 + -4 < lVar28) goto LAB_0068cc5a;
              ChQuaternion<double>::
              ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                        (&local_278,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_2b8,(type *)0x0);
              auVar195._8_8_ = 0;
              auVar195._0_8_ = local_1c8.m_data[2];
              auVar214._8_8_ = 0;
              auVar214._0_8_ = local_278.m_data[0];
              auVar235._8_8_ = 0;
              auVar235._0_8_ = local_1c8.m_data[1];
              auVar180._8_8_ = 0;
              auVar180._0_8_ = local_1c8.m_data[0];
              auVar224._8_8_ = 0;
              auVar224._0_8_ = local_278.m_data[2];
              auVar243._8_8_ = 0;
              auVar243._0_8_ = local_278.m_data[1];
              auVar161._8_8_ = 0;
              auVar161._0_8_ = local_1c8.m_data[3];
              auVar103._8_8_ = 0;
              auVar103._0_8_ = local_278.m_data[3];
              dVar98 = 1.0;
              dVar233 = 0.0;
              dVar74 = 0.0;
              dVar47 = 0.0;
              auVar264._8_8_ = 0;
              auVar264._0_8_ = local_278.m_data[0] * local_1c8.m_data[2];
              auVar54 = vfmsub231sd_fma(auVar264,auVar180,auVar224);
              auVar256._8_8_ = 0;
              auVar256._0_8_ = local_278.m_data[0] * local_1c8.m_data[1];
              auVar50 = vfmsub231sd_fma(auVar256,auVar180,auVar243);
              auVar269._8_8_ = 0;
              auVar269._0_8_ = local_278.m_data[0] * local_1c8.m_data[3];
              auVar51 = vfmsub231sd_fma(auVar269,auVar180,auVar103);
              auVar52 = vfnmadd231sd_fma(auVar54,auVar161,auVar243);
              auVar54 = vfmadd231sd_fma(auVar50,auVar161,auVar224);
              auVar50 = vfmadd231sd_fma(auVar51,auVar195,auVar243);
              auVar51 = vfmadd231sd_fma(auVar52,auVar235,auVar103);
              auVar52 = vfnmadd231sd_fma(auVar54,auVar195,auVar103);
              auVar50 = vfnmadd231sd_fma(auVar50,auVar235,auVar224);
              dVar127 = auVar51._0_8_;
              auVar251._8_8_ = 0;
              auVar251._0_8_ = dVar127 * dVar127;
              auVar54 = vfmadd231sd_fma(auVar251,auVar52,auVar52);
              auVar54 = vfmadd231sd_fma(auVar54,auVar50,auVar50);
              if (0.0 < auVar54._0_8_) {
                local_2e0 = auVar52._0_8_;
                local_f8 = (undefined1  [8])auVar50._0_8_;
                auVar79._8_8_ = 0;
                auVar79._0_8_ = local_1c8.m_data[1] * local_278.m_data[1];
                auVar50 = vfmadd213sd_fma(auVar214,auVar180,auVar79);
                auVar54 = vsqrtsd_avx(auVar54,auVar54);
                auVar50 = vfmadd213sd_fma(auVar224,auVar195,auVar50);
                auVar50 = vfmadd213sd_fma(auVar103,auVar161,auVar50);
                local_240 = auVar54._0_8_;
                dVar47 = atan2(local_240,auVar50._0_8_);
                dVar47 = dVar47 + dVar47;
                dVar233 = 1.0 / local_240;
                dVar127 = dVar233 * dVar127;
                auVar130._8_8_ = 0;
                auVar130._0_8_ = dVar233 * local_2e0;
                auVar162._8_8_ = 0;
                auVar162._0_8_ = dVar127 * dVar127;
                auVar54 = vfmadd231sd_fma(auVar162,auVar130,auVar130);
                auVar104._8_8_ = 0;
                auVar104._0_8_ = dVar233 * (double)local_f8;
                auVar54 = vfmadd231sd_fma(auVar54,auVar104,auVar104);
                auVar54 = vsqrtsd_avx(auVar54,auVar54);
                dVar157 = 1.0 / auVar54._0_8_;
                bVar11 = 2.2250738585072014e-308 <= auVar54._0_8_;
                dVar74 = (double)((ulong)bVar11 * (long)(dVar233 * (double)local_f8 * dVar157));
                dVar49 = -6.283185307179586;
                dVar98 = (double)((ulong)bVar11 * (long)(dVar233 * local_2e0 * dVar157) +
                                 (ulong)!bVar11 * 0x3ff0000000000000);
                dVar233 = (double)((ulong)bVar11 * (long)(dVar127 * dVar157));
                if ((3.141592653589793 < dVar47) ||
                   (dVar49 = 6.283185307179586, dVar47 < -3.141592653589793)) {
                  dVar47 = dVar47 + dVar49;
                }
              }
              if (((long)local_2f8._8_8_ < 2) || (local_2e8 <= (long)uVar39)) goto LAB_0068cc38;
              lVar33 = lVar33 + 0x38;
              lVar28 = lVar28 + 7;
              dVar127 = *(double *)(local_2f8._0_8_ + (local_2e8 + uVar39) * 8);
              psVar30 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              psVar32 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar39 = uVar39 + 1;
              local_318 = local_318 + dVar98 * dVar47 * dVar127;
              local_330 = local_330 + dVar233 * dVar47 * dVar127;
              local_320 = local_320 + dVar74 * dVar47 * dVar127;
            } while (uVar39 < (ulong)((long)psVar32 - (long)psVar30 >> 4));
            if (psVar32 == psVar30) goto LAB_0068b065;
            lVar28 = 0x18;
            lVar48 = 3;
            lVar33 = 3;
            lVar45 = 0x18;
            uVar39 = 0;
            local_300 = 0.0;
            local_2e0 = 0.0;
            auVar61._56_8_ = 0;
            auVar61._0_56_ = _auStack_f0;
            _local_f8 = auVar61 << 0x40;
            do {
              lStack_288 = (state_x->super_ChVectorDynamic<double>).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows;
              local_2b8.m_data[0] =
                   (double)((long)(state_x->super_ChVectorDynamic<double>).
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data + lVar45);
              local_2b8.m_data[1] = 1.97626258336499e-323;
              local_2b8.m_data[3] = (double)state_x;
              lStack_298 = lVar33;
              if (lStack_288 + -4 < lVar33) goto LAB_0068cc5a;
              ChQuaternion<double>::
              ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                        (&local_278,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_2b8,(type *)0x0);
              lStack_288 = (local_190->super_ChVectorDynamic<double>).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows;
              local_2b8.m_data[0] =
                   (double)((long)(local_190->super_ChVectorDynamic<double>).
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data + lVar28);
              local_2b8.m_data[1] = 1.48219693752374e-323;
              local_2b8.m_data[3] = (double)local_190;
              lStack_298 = lVar48;
              if (lStack_288 + -3 < lVar48) goto LAB_0068cc5a;
              ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                        (&local_238,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_2b8,(type *)0x0);
              if (((long)local_2f8._8_8_ < 2) || (local_2e8 <= (long)uVar39)) goto LAB_0068cc38;
              auVar53 = ZEXT816(0xbff0000000000000);
              auVar158 = ZEXT816(0x4000000000000000);
              auVar244._8_8_ = 0;
              auVar244._0_8_ = local_238.m_data[0];
              auVar257._8_8_ = 0;
              auVar257._0_8_ = local_238.m_data[2];
              lVar45 = lVar45 + 0x38;
              lVar33 = lVar33 + 7;
              lVar28 = lVar28 + 0x30;
              lVar48 = lVar48 + 6;
              dVar74 = local_278.m_data[0] * local_278.m_data[0];
              dVar127 = local_278.m_data[1] * local_278.m_data[2] -
                        local_278.m_data[0] * local_278.m_data[3];
              dVar47 = local_278.m_data[1] * local_278.m_data[2] +
                       local_278.m_data[0] * local_278.m_data[3];
              auVar181._8_8_ = 0;
              auVar181._0_8_ = dVar74 + local_278.m_data[2] * local_278.m_data[2];
              auVar54 = vfmadd213sd_fma(auVar181,auVar158,auVar53);
              auVar143._8_8_ = 0;
              auVar143._0_8_ = dVar74 + local_278.m_data[1] * local_278.m_data[1];
              auVar50 = vfmadd213sd_fma(auVar143,auVar158,auVar53);
              auVar196._8_8_ = 0;
              auVar196._0_8_ = local_238.m_data[1] * (dVar127 + dVar127);
              auVar50 = vfmadd231sd_fma(auVar196,auVar244,auVar50);
              dVar127 = local_278.m_data[0] * local_278.m_data[2] +
                        local_278.m_data[1] * local_278.m_data[3];
              dVar233 = local_278.m_data[1] * local_278.m_data[3] -
                        local_278.m_data[0] * local_278.m_data[2];
              auVar80._8_8_ = 0;
              auVar80._0_8_ = dVar47 + dVar47;
              auVar182._8_8_ = 0;
              auVar182._0_8_ = local_238.m_data[1] * auVar54._0_8_;
              auVar51 = vfmadd231sd_fma(auVar182,auVar244,auVar80);
              dVar98 = local_278.m_data[2] * local_278.m_data[3] -
                       local_278.m_data[0] * local_278.m_data[1];
              dVar47 = local_278.m_data[0] * local_278.m_data[1] +
                       local_278.m_data[2] * local_278.m_data[3];
              auVar144._8_8_ = 0;
              auVar144._0_8_ = dVar127 + dVar127;
              auVar54 = vfmadd213sd_fma(auVar144,auVar257,auVar50);
              auVar81._8_8_ = 0;
              auVar81._0_8_ = dVar98 + dVar98;
              auVar50 = vfmadd213sd_fma(auVar81,auVar257,auVar51);
              auVar105._8_8_ = 0;
              auVar105._0_8_ = dVar233 + dVar233;
              auVar163._8_8_ = 0;
              auVar163._0_8_ = local_238.m_data[1] * (dVar47 + dVar47);
              auVar52 = vfmadd231sd_fma(auVar163,auVar244,auVar105);
              dVar47 = *(double *)(local_2f8._0_8_ + (local_2e8 + uVar39) * 8);
              uVar39 = uVar39 + 1;
              auVar106._8_8_ = 0;
              auVar106._0_8_ = dVar74 + local_278.m_data[3] * local_278.m_data[3];
              auVar51 = vfmadd213sd_fma(auVar106,auVar158,auVar53);
              auVar51 = vfmadd213sd_fma(auVar51,auVar257,auVar52);
              local_300 = local_300 + auVar54._0_8_ * dVar47;
              dVar127 = (double)local_f8 + auVar51._0_8_ * dVar47;
              local_f8 = (undefined1  [8])dVar127;
              dVar74 = local_2e0 + auVar50._0_8_ * dVar47;
              Fi = local_1a0;
              local_2e0 = dVar74;
            } while (uVar39 < (ulong)((long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4));
          }
          dVar47 = local_250;
          auVar18._8_8_ = dStack_140;
          auVar18._0_8_ = local_148;
          auVar236._8_8_ = 0;
          auVar236._0_8_ =
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
          auVar20._8_8_ = uStack_130;
          auVar20._0_8_ = local_138;
          auVar16._8_8_ =
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          auVar16._0_8_ =
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
          auVar17._8_8_ =
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
          auVar17._0_8_ =
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [6];
          auVar275 = ZEXT1664(auVar17);
          pCVar35 = (this->strain_e_0).
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          auVar252._8_8_ = 0;
          auVar252._0_8_ =
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
          dVar233 = local_80[3] * (double)local_2d8._0_8_;
          auVar50 = vmulsd_avx512f(auVar18,auVar236);
          auVar51 = vmovddup_avx512vl(auVar18);
          auVar52 = vshufpd_avx512vl(auVar18,auVar18,1);
          auVar53 = vshufpd_avx512vl(auVar18,auVar18,3);
          dVar98 = local_80[3] * local_2c8._0_8_;
          auVar54 = vshufpd_avx(local_2c8,local_2c8,1);
          dVar74 = local_80[3] * dVar74;
          local_300 = local_80[3] * local_300;
          dVar49 = local_80[3] * auVar54._0_8_;
          dVar127 = local_80[3] * dVar127;
          auVar270._0_8_ =
               auVar51._0_8_ *
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar270._8_8_ =
               auVar51._8_8_ *
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
          auVar276._8_8_ = 0;
          auVar276._0_8_ =
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
          auVar54 = vfmadd231sd_avx512f(auVar50,auVar276,auVar20);
          auVar50 = vmovddup_avx512vl(auVar20);
          auVar50 = vfmadd213pd_avx512vl(auVar50,auVar16,auVar270);
          auVar54 = vfmadd231sd_fma(auVar54,auVar252,auVar52);
          auVar50 = vfmadd213pd_avx512vl(auVar53,auVar17,auVar50);
          auVar50 = vsubpd_avx512vl(auVar50,_VECT_X);
          local_238.m_data._0_16_ =
               vsubpd_avx512vl(auVar50,*(undefined1 (*) [16])pCVar35[(long)local_250].m_data);
          auVar107._8_8_ = 0;
          auVar107._0_8_ = dVar98;
          auVar50 = vmulsd_avx512f(auVar107,auVar236);
          local_238.m_data[2] = (auVar54._0_8_ - DAT_00b689c0) - pCVar35[(long)local_250].m_data[2];
          auVar108._0_8_ =
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3] * dVar98;
          auVar108._8_8_ =
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] * dVar98;
          auVar82._8_8_ = 0;
          auVar82._0_8_ = dVar233;
          auVar54 = vfmadd231sd_avx512f(auVar50,auVar276,auVar82);
          auVar83._8_8_ = dVar233;
          auVar83._0_8_ = dVar233;
          auVar50 = vfmadd213pd_avx512vl(auVar83,auVar16,auVar108);
          auVar109._8_8_ = dVar49;
          auVar109._0_8_ = dVar49;
          auVar131._8_8_ = 0;
          auVar131._0_8_ = dVar49;
          auVar54 = vfmadd231sd_avx512f(auVar54,auVar252,auVar131);
          auVar132._8_8_ = local_300;
          auVar132._0_8_ = local_300;
          local_b8.m_data._0_16_ = vfmadd213pd_avx512vl(auVar109,auVar17,auVar50);
          vmovsd_avx512f(auVar54);
          pCVar35 = (this->strain_k_0).
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          auVar110._0_8_ =
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3] * dVar74;
          auVar110._8_8_ =
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] * dVar74;
          auVar54 = vfmadd213pd_avx512vl(auVar132,auVar16,auVar110);
          auVar111._8_8_ = dVar127;
          auVar111._0_8_ = dVar127;
          local_110.m_data[0] = local_80[3] * local_318 - pCVar35[(long)local_250].m_data[0];
          auStack_48 = vfmadd213pd_avx512vl(auVar111,auVar17,auVar54);
          local_110.m_data[1] = local_80[3] * local_330 - pCVar35[(long)local_250].m_data[1];
          local_110.m_data[2] = local_80[3] * local_320 - pCVar35[(long)local_250].m_data[2];
          local_168.m_data[2] = 0.0;
          local_188.m_data[2] = 0.0;
          local_98.
          super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          auVar84._8_8_ = 0;
          auVar84._0_8_ =
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5] * dVar74;
          auVar197._8_8_ = 0;
          auVar197._0_8_ = local_300;
          auVar277._8_8_ = 0;
          auVar277._0_8_ =
               local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
          auVar54 = vfmadd231sd_avx512f(auVar84,auVar197,auVar277);
          auVar215._8_8_ = 0;
          auVar215._0_8_ = dVar127;
          auVar54 = vfmadd231sd_fma(auVar54,auVar215,auVar252);
          local_38 = auVar54._0_8_;
          local_168.m_data[0] = 0.0;
          local_168.m_data[1] = 0.0;
          local_188.m_data[0] = 0.0;
          local_188.m_data[1] = 0.0;
          local_98.
          super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.
          super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          peVar6 = (this->section).
                   super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          peVar7 = (peVar6->plasticity).
                   super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          p_Var46 = (peVar6->plasticity).
                    super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (p_Var46 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var46->_M_use_count = p_Var46->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var46->_M_use_count = p_Var46->_M_use_count + 1;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var46);
          }
          if (peVar7 == (element_type *)0x0) {
            _Var40._M_head_impl = (ChBeamMaterialInternalData *)0x0;
            _Var44._M_head_impl = (ChBeamMaterialInternalData *)0x0;
          }
          else {
            _Var40._M_head_impl =
                 *(ChBeamMaterialInternalData **)
                  &(this->plastic_data_old).
                   super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar47]._M_t.
                   super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                   ._M_t;
            if ((char)local_1cc == '\0') {
              _Var44._M_head_impl =
                   *(ChBeamMaterialInternalData **)
                    &(this->plastic_data).
                     super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)dVar47]._M_t.
                     super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                     ._M_t;
            }
            else {
              peVar6 = (this->section).
                       super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              peVar7 = (peVar6->plasticity).
                       super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              p_Var46 = (peVar6->plasticity).
                        super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var46 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var46->_M_use_count = p_Var46->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var46->_M_use_count = p_Var46->_M_use_count + 1;
                }
              }
              (*peVar7->_vptr_ChPlasticityCosserat[4])(peVar7,1,&local_98);
              if (p_Var46 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var46);
              }
              _Var44._M_head_impl =
                   ((local_98.
                     super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
                   .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>.
                   _M_head_impl;
            }
          }
          peVar6 = (this->section).
                   super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*(peVar6->super_ChBeamSection)._vptr_ChBeamSection[2])
                    (peVar6,&local_168,&local_188,&local_238,&local_110,_Var44._M_head_impl,
                     _Var40._M_head_impl);
          if ((char)local_1cc == '\0') {
            pCVar34 = (this->stress_n).
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar47;
            if (&local_168 != pCVar34) {
              pCVar34->m_data[0] = local_168.m_data[0];
              pCVar34->m_data[1] = local_168.m_data[1];
              pCVar34->m_data[2] = local_168.m_data[2];
            }
            pCVar34 = (this->stress_m).
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar47;
            if (&local_188 != pCVar34) {
              pCVar34->m_data[0] = local_188.m_data[0];
              pCVar34->m_data[1] = local_188.m_data[1];
              pCVar34->m_data[2] = local_188.m_data[2];
            }
            pCVar35 = (this->strain_e).
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar47;
            if (&local_238 != pCVar35) {
              pCVar35->m_data[0] = local_238.m_data[0];
              pCVar35->m_data[1] = local_238.m_data[1];
              pCVar35->m_data[2] = local_238.m_data[2];
            }
            pCVar34 = (this->strain_k).
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)dVar47;
            if (&local_110 != pCVar34) {
              pCVar34->m_data[0] = local_110.m_data[0];
              pCVar34->m_data[1] = local_110.m_data[1];
              pCVar34->m_data[2] = local_110.m_data[2];
            }
          }
          peVar6 = (this->section).
                   super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          peVar41 = (peVar6->damping).
                    super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          p_Var46 = (peVar6->damping).
                    super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (p_Var46 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (peVar41 != (element_type *)0x0) {
LAB_0068b525:
              bVar11 = true;
              p_Var46 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              goto LAB_0068b535;
            }
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var46->_M_use_count = p_Var46->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var46->_M_use_count = p_Var46->_M_use_count + 1;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var46);
            if (peVar41 != (element_type *)0x0) {
              peVar6 = (this->section).
                       super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              peVar41 = (peVar6->damping).
                        super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              p_Var46 = (peVar6->damping).
                        super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var46 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0068b525;
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var46->_M_use_count = p_Var46->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var46->_M_use_count = p_Var46->_M_use_count + 1;
              }
              bVar11 = false;
LAB_0068b535:
              local_278.m_data[2] = 0.0;
              local_278.m_data[1] = 0.0;
              local_278.m_data[0] = 0.0;
              local_2b8.m_data[2] = 0.0;
              local_2b8.m_data[1] = 0.0;
              local_2b8.m_data[0] = 0.0;
              (*peVar41->_vptr_ChDampingCosserat[2])(peVar41,&local_2b8,&local_278,&local_b8);
              if (!bVar11) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var46);
              }
              local_168.m_data[0] = local_2b8.m_data[0] + local_168.m_data[0];
              local_168.m_data[1] = local_2b8.m_data[1] + local_168.m_data[1];
              local_168.m_data[2] = local_2b8.m_data[2] + local_168.m_data[2];
              local_188.m_data[0] = local_278.m_data[0] + local_188.m_data[0];
              local_188.m_data[1] = local_278.m_data[1] + local_188.m_data[1];
              local_188.m_data[2] = local_278.m_data[2] + local_188.m_data[2];
              dVar47 = local_250;
            }
          }
          auVar54 = auVar275._0_16_;
          if ((this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            auVar85._8_8_ = 0;
            auVar85._0_8_ =
                 local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
            auVar133._8_8_ = 0;
            auVar133._0_8_ = local_168.m_data[0];
            auVar164._8_8_ = 0;
            auVar164._0_8_ =
                 local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar198._8_8_ = 0;
            auVar198._0_8_ =
                 local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
            auVar216._8_8_ = 0;
            auVar216._0_8_ =
                 local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
            auVar225._8_8_ = 0;
            auVar225._0_8_ =
                 local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
            auVar183._8_8_ = 0;
            auVar183._0_8_ = local_168.m_data[2];
            uVar39 = 0;
            auVar145._8_8_ = 0;
            auVar145._0_8_ = local_188.m_data[0];
            auVar245._8_8_ = 0;
            auVar245._0_8_ =
                 local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] * local_168.m_data[1];
            auVar54 = vfmadd231sd_fma(auVar245,auVar85,auVar133);
            auVar253._8_8_ = 0;
            auVar253._0_8_ =
                 local_168.m_data[1] *
                 local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
            auVar50 = vfmadd231sd_fma(auVar253,auVar198,auVar133);
            auVar258._8_8_ = 0;
            auVar258._0_8_ =
                 local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7] * local_168.m_data[1];
            auVar51 = vfmadd231sd_fma(auVar258,auVar225,auVar133);
            auVar134._8_8_ = 0;
            auVar134._0_8_ =
                 local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            auVar50 = vfmadd231sd_fma(auVar50,auVar216,auVar183);
            auVar53 = vfmadd231sd_fma(auVar54,auVar164,auVar183);
            auVar112._8_8_ = 0;
            auVar112._0_8_ =
                 local_188.m_data[1] *
                 local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
            auVar54 = vfmadd231sd_fma(auVar112,auVar145,auVar85);
            auVar86._8_8_ = 0;
            auVar86._0_8_ = local_188.m_data[2];
            auVar51 = vfmadd231sd_fma(auVar51,auVar134,auVar183);
            local_2c8._0_8_ = auVar51._0_8_;
            auVar54 = vfmadd231sd_fma(auVar54,auVar86,auVar164);
            local_2d8._0_8_ = auVar54._0_8_;
            auVar113._8_8_ = 0;
            auVar113._0_8_ =
                 local_188.m_data[1] *
                 local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
            auVar54 = vfmadd231sd_fma(auVar113,auVar145,auVar198);
            auVar54 = vfmadd231sd_fma(auVar54,auVar86,auVar216);
            local_f8 = (undefined1  [8])auVar54._0_8_;
            auVar114._8_8_ = 0;
            auVar114._0_8_ =
                 local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7] * local_188.m_data[1];
            auVar54 = vfmadd231sd_fma(auVar114,auVar225,auVar145);
            auVar158 = vfmadd231sd_fma(auVar54,auVar134,auVar86);
            auVar22._8_8_ = lStack_50;
            auVar22._0_8_ = lStack_58;
            auVar13._8_8_ = 0x8000000000000000;
            auVar13._0_8_ = 0x8000000000000000;
            auVar54 = vxorpd_avx512vl(auVar22,auVar13);
            dVar127 = auVar54._0_8_ * local_198;
            auVar19._8_8_ = dStack_140;
            auVar19._0_8_ = local_148;
            auVar87._8_8_ = 0;
            auVar87._0_8_ = auVar50._0_8_ * auVar52._0_8_;
            auVar54 = vfmsub231sd_fma(auVar87,auVar19,auVar51);
            local_2e0 = auVar54._0_8_;
            auVar21._8_8_ = uStack_130;
            auVar21._0_8_ = local_138;
            auVar115._8_8_ = 0;
            auVar115._0_8_ = auVar53._0_8_ * local_148;
            auVar54 = vfmsub231sd_fma(auVar115,auVar50,auVar21);
            auVar165._8_8_ = 0;
            auVar165._0_8_ = auVar51._0_8_ * local_138;
            auVar51 = vfmsub231sd_fma(auVar165,auVar53,auVar52);
            local_250 = auVar54._0_8_;
            local_240 = auVar51._0_8_;
            local_248 = dVar127 * local_248;
            do {
              if (((long)local_2f8._8_8_ < 2) || (local_2e8 <= (long)uVar39)) goto LAB_0068cc38;
              dVar74 = *(double *)(local_2f8._0_8_ + (local_2e8 + uVar39) * 8);
              local_80[0] = dVar127 * dVar74 * auVar53._0_8_;
              local_80[1] = dVar127 * dVar74 * auVar50._0_8_;
              local_80[2] = dVar127 * dVar74 * (double)local_2c8._0_8_;
              if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows + -3 < (long)(uVar39 * 6)) goto LAB_0068cc5a;
              pauVar31 = (undefined1 (*) [64])
                         ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data + uVar39 * 6);
              uVar37 = 3;
              if (((ulong)pauVar31 & 7) == 0) {
                uVar36 = -((uint)((ulong)pauVar31 >> 3) & 0x1fffffff) & 7;
                if (uVar36 < 3) {
                  uVar37 = uVar36;
                }
                if (uVar36 != 0) goto LAB_0068b827;
              }
              else {
LAB_0068b827:
                auVar61 = vpbroadcastq_avx512f();
                uVar38 = vpcmpuq_avx512f(auVar61,_DAT_009825c0,5);
                bVar10 = (byte)uVar38;
                auVar63._8_8_ = (ulong)((byte)(uVar38 >> 1) & 1) * (long)local_80[1];
                auVar63._0_8_ = (ulong)(bVar10 & 1) * (long)local_80[0];
                auVar63._16_8_ = (ulong)((byte)(uVar38 >> 2) & 1) * (long)local_80[2];
                auVar63._24_8_ = (ulong)((byte)(uVar38 >> 3) & 1) * (long)local_80[3];
                auVar63._32_8_ = (ulong)((byte)(uVar38 >> 4) & 1) * lStack_60;
                auVar63._40_8_ = (ulong)((byte)(uVar38 >> 5) & 1) * lStack_58;
                auVar63._48_8_ = (ulong)((byte)(uVar38 >> 6) & 1) * lStack_50;
                auVar63._56_8_ = (uVar38 >> 7) * auStack_48._0_8_;
                auVar62._8_8_ = (ulong)((byte)(uVar38 >> 1) & 1) * *(long *)(*pauVar31 + 8);
                auVar62._0_8_ = (ulong)(bVar10 & 1) * *(long *)*pauVar31;
                auVar62._16_8_ = (ulong)((byte)(uVar38 >> 2) & 1) * *(long *)(*pauVar31 + 0x10);
                auVar62._24_8_ = (ulong)((byte)(uVar38 >> 3) & 1) * *(long *)(*pauVar31 + 0x18);
                auVar62._32_8_ = (ulong)((byte)(uVar38 >> 4) & 1) * *(long *)(*pauVar31 + 0x20);
                auVar62._40_8_ = (ulong)((byte)(uVar38 >> 5) & 1) * *(long *)(*pauVar31 + 0x28);
                auVar62._48_8_ = (ulong)((byte)(uVar38 >> 6) & 1) * *(long *)(*pauVar31 + 0x30);
                auVar62._56_8_ = (uVar38 >> 7) * *(long *)(*pauVar31 + 0x38);
                auVar63 = vaddpd_avx512f(auVar63,auVar62);
                auVar61 = *pauVar31;
                auVar64._0_8_ =
                     (ulong)(bVar10 & 1) * auVar63._0_8_ |
                     (ulong)!(bool)(bVar10 & 1) * auVar61._0_8_;
                bVar11 = (bool)((byte)(uVar38 >> 1) & 1);
                auVar64._8_8_ = (ulong)bVar11 * auVar63._8_8_ | (ulong)!bVar11 * auVar61._8_8_;
                bVar11 = (bool)((byte)(uVar38 >> 2) & 1);
                auVar64._16_8_ = (ulong)bVar11 * auVar63._16_8_ | (ulong)!bVar11 * auVar61._16_8_;
                bVar11 = (bool)((byte)(uVar38 >> 3) & 1);
                auVar64._24_8_ = (ulong)bVar11 * auVar63._24_8_ | (ulong)!bVar11 * auVar61._24_8_;
                bVar11 = (bool)((byte)(uVar38 >> 4) & 1);
                auVar64._32_8_ = (ulong)bVar11 * auVar63._32_8_ | (ulong)!bVar11 * auVar61._32_8_;
                bVar11 = (bool)((byte)(uVar38 >> 5) & 1);
                auVar64._40_8_ = (ulong)bVar11 * auVar63._40_8_ | (ulong)!bVar11 * auVar61._40_8_;
                bVar11 = (bool)((byte)(uVar38 >> 6) & 1);
                auVar64._48_8_ = (ulong)bVar11 * auVar63._48_8_ | (ulong)!bVar11 * auVar61._48_8_;
                auVar64._56_8_ =
                     (uVar38 >> 7) * auVar63._56_8_ | (ulong)!SUB81(uVar38 >> 7,0) * auVar61._56_8_;
                *pauVar31 = auVar64;
              }
              if (uVar37 < 3) {
                uVar42 = (ulong)(uVar37 << 3);
                auVar55 = vpbroadcastq_avx512vl();
                uVar38 = vpcmpuq_avx512vl(auVar55,_DAT_00955380,5);
                uVar38 = uVar38 & 0xf;
                bVar10 = (byte)uVar38;
                plVar1 = (long *)(*pauVar31 + uVar42);
                auVar55 = *(undefined1 (*) [32])(*pauVar31 + uVar42);
                auVar58._0_8_ =
                     (ulong)(bVar10 & 1) *
                     (long)((double)((ulong)(bVar10 & 1) * *(long *)((long)local_80 + uVar42)) +
                           (double)((ulong)(bVar10 & 1) * *plVar1)) |
                     (ulong)!(bool)(bVar10 & 1) * auVar55._0_8_;
                bVar11 = (bool)((byte)(uVar38 >> 1) & 1);
                auVar58._8_8_ =
                     (ulong)bVar11 *
                     (long)((double)((ulong)((byte)(uVar38 >> 1) & 1) *
                                    *(long *)((long)local_80 + uVar42 + 8)) +
                           (double)((ulong)((byte)(uVar38 >> 1) & 1) * plVar1[1])) |
                     (ulong)!bVar11 * auVar55._8_8_;
                bVar11 = (bool)((byte)(uVar38 >> 2) & 1);
                auVar58._16_8_ =
                     (ulong)bVar11 *
                     (long)((double)((ulong)((byte)(uVar38 >> 2) & 1) *
                                    *(long *)((long)local_80 + uVar42 + 0x10)) +
                           (double)((ulong)((byte)(uVar38 >> 2) & 1) * plVar1[2])) |
                     (ulong)!bVar11 * auVar55._16_8_;
                auVar58._24_8_ =
                     (uVar38 >> 3) *
                     (long)((double)((uVar38 >> 3) * *(long *)((long)local_80 + uVar42 + 0x18)) +
                           (double)((uVar38 >> 3) * plVar1[3])) |
                     (ulong)!SUB81(uVar38 >> 3,0) * auVar55._24_8_;
                *(undefined1 (*) [32])(*pauVar31 + uVar42) = auVar58;
              }
              lStack_288 = (state_x->super_ChVectorDynamic<double>).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows;
              local_2b8.m_data[0] =
                   (double)((state_x->super_ChVectorDynamic<double>).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                            .m_data + uVar39 * 7 + 3);
              lStack_298 = uVar39 * 7 + 3;
              local_2b8.m_data[1] = 1.97626258336499e-323;
              local_2b8.m_data[3] = (double)state_x;
              if (lStack_288 + -4 < lStack_298) goto LAB_0068cc5a;
              ChQuaternion<double>::
              ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                        (&local_278,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_2b8,(type *)0x0);
              auVar54 = auVar275._0_16_;
              if (((long)local_2f8._8_8_ < 2) || (local_2e8 <= (long)uVar39)) goto LAB_0068cc38;
              auVar178 = ZEXT816(0xbff0000000000000);
              auVar204 = ZEXT816(0x4000000000000000);
              dVar74 = ((double *)(local_2f8._0_8_ + uVar39 * 8))[local_2e8];
              dVar233 = *(double *)(local_2f8._0_8_ + uVar39 * 8);
              dVar49 = dVar127 * dVar74 * auVar158._0_8_ - local_248 * dVar233 * local_250;
              auVar146._8_8_ = 0;
              auVar146._0_8_ = local_278.m_data[0];
              dVar157 = dVar127 * dVar74 * (double)local_2d8._0_8_ - local_248 * dVar233 * local_2e0
              ;
              dVar156 = dVar127 * dVar74 * (double)local_f8 - local_248 * dVar233 * local_240;
              dVar98 = local_278.m_data[0] * local_278.m_data[0];
              auVar14._8_8_ = 0x8000000000000000;
              auVar14._0_8_ = 0x8000000000000000;
              auVar52 = vxorpd_avx512vl(auVar146,auVar14);
              auVar217._8_8_ = 0;
              auVar217._0_8_ = local_278.m_data[2] * local_278.m_data[2] + dVar98;
              auVar51 = vfmadd213sd_fma(auVar217,auVar204,auVar178);
              dVar140 = auVar52._0_8_;
              auVar199._8_8_ = 0;
              auVar199._0_8_ = dVar98 + local_278.m_data[1] * local_278.m_data[1];
              auVar52 = vfmadd213sd_fma(auVar199,auVar204,auVar178);
              dVar233 = local_278.m_data[1] * local_278.m_data[2] - local_278.m_data[3] * dVar140;
              dVar74 = local_278.m_data[1] * local_278.m_data[2] + local_278.m_data[3] * dVar140;
              auVar116._8_8_ = 0;
              auVar116._0_8_ = dVar157;
              auVar147._8_8_ = 0;
              auVar147._0_8_ = dVar74 + dVar74;
              auVar218._8_8_ = 0;
              auVar218._0_8_ = auVar51._0_8_ * dVar156;
              auVar51 = vfmadd231sd_fma(auVar218,auVar116,auVar147);
              dVar12 = local_278.m_data[3] * local_278.m_data[2] - local_278.m_data[1] * dVar140;
              dVar74 = local_278.m_data[1] * dVar140 + local_278.m_data[3] * local_278.m_data[2];
              auVar226._8_8_ = 0;
              auVar226._0_8_ = (dVar233 + dVar233) * dVar156;
              auVar52 = vfmadd231sd_fma(auVar226,auVar116,auVar52);
              dVar233 = local_278.m_data[2] * dVar140 + local_278.m_data[3] * local_278.m_data[1];
              dVar140 = local_278.m_data[3] * local_278.m_data[1] - local_278.m_data[2] * dVar140;
              auVar88._8_8_ = 0;
              auVar88._0_8_ = dVar49;
              auVar148._8_8_ = 0;
              auVar148._0_8_ = dVar12 + dVar12;
              auVar51 = vfmadd213sd_fma(auVar148,auVar88,auVar51);
              auVar117._8_8_ = 0;
              auVar117._0_8_ = dVar157;
              auVar135._8_8_ = 0;
              auVar135._0_8_ = dVar156 * (dVar74 + dVar74);
              auVar166._8_8_ = 0;
              auVar166._0_8_ = dVar140 + dVar140;
              auVar193 = vfmadd231sd_fma(auVar135,auVar117,auVar166);
              auVar200._8_8_ = 0;
              auVar200._0_8_ = dVar233 + dVar233;
              auVar52 = vfmadd213sd_fma(auVar200,auVar88,auVar52);
              auVar167._8_8_ = 0;
              auVar167._0_8_ = local_278.m_data[3] * local_278.m_data[3] + dVar98;
              auVar178 = vfmadd213sd_fma(auVar167,auVar204,auVar178);
              local_2b8.m_data[0] = (double)auVar52._0_8_;
              local_2b8.m_data[1] = auVar51._0_8_;
              auVar89._8_8_ = 0;
              auVar89._0_8_ = dVar49;
              auVar178 = vfmadd213sd_fma(auVar178,auVar89,auVar193);
              local_2b8.m_data[2] = auVar178._0_8_;
              if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows + -3 < (long)(uVar39 * 6 + 3)) goto LAB_0068cc5a;
              pauVar31 = (undefined1 (*) [64])
                         ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data + uVar39 * 6 + 3);
              uVar37 = 3;
              if (((ulong)pauVar31 & 7) == 0) {
                uVar36 = -((uint)((ulong)pauVar31 >> 3) & 0x1fffffff) & 7;
                if (uVar36 < 3) {
                  uVar37 = uVar36;
                }
                if (uVar36 != 0) goto LAB_0068bad4;
              }
              else {
LAB_0068bad4:
                auVar61 = vpbroadcastq_avx512f();
                uVar38 = vpcmpuq_avx512f(auVar61,_DAT_009825c0,5);
                bVar10 = (byte)uVar38;
                auVar65._8_8_ = (ulong)((byte)(uVar38 >> 1) & 1) * (long)auVar51._0_8_;
                auVar65._0_8_ = (ulong)(bVar10 & 1) * (long)auVar52._0_8_;
                auVar65._16_8_ = (ulong)((byte)(uVar38 >> 2) & 1) * (long)auVar178._0_8_;
                auVar65._24_8_ = (ulong)((byte)(uVar38 >> 3) & 1) * (long)local_2b8.m_data[3];
                auVar65._32_8_ = (ulong)((byte)(uVar38 >> 4) & 1) * lStack_298;
                auVar65._40_8_ = (ulong)((byte)(uVar38 >> 5) & 1) * (long)dStack_290;
                auVar65._48_8_ = (ulong)((byte)(uVar38 >> 6) & 1) * lStack_288;
                auVar65._56_8_ = (uVar38 >> 7) * lStack_280;
                auVar66._8_8_ = (ulong)((byte)(uVar38 >> 1) & 1) * *(long *)(*pauVar31 + 8);
                auVar66._0_8_ = (ulong)(bVar10 & 1) * *(long *)*pauVar31;
                auVar66._16_8_ = (ulong)((byte)(uVar38 >> 2) & 1) * *(long *)(*pauVar31 + 0x10);
                auVar66._24_8_ = (ulong)((byte)(uVar38 >> 3) & 1) * *(long *)(*pauVar31 + 0x18);
                auVar66._32_8_ = (ulong)((byte)(uVar38 >> 4) & 1) * *(long *)(*pauVar31 + 0x20);
                auVar66._40_8_ = (ulong)((byte)(uVar38 >> 5) & 1) * *(long *)(*pauVar31 + 0x28);
                auVar66._48_8_ = (ulong)((byte)(uVar38 >> 6) & 1) * *(long *)(*pauVar31 + 0x30);
                auVar66._56_8_ = (uVar38 >> 7) * *(long *)(*pauVar31 + 0x38);
                auVar63 = vaddpd_avx512f(auVar65,auVar66);
                auVar61 = *pauVar31;
                auVar67._0_8_ =
                     (ulong)(bVar10 & 1) * auVar63._0_8_ |
                     (ulong)!(bool)(bVar10 & 1) * auVar61._0_8_;
                bVar11 = (bool)((byte)(uVar38 >> 1) & 1);
                auVar67._8_8_ = (ulong)bVar11 * auVar63._8_8_ | (ulong)!bVar11 * auVar61._8_8_;
                bVar11 = (bool)((byte)(uVar38 >> 2) & 1);
                auVar67._16_8_ = (ulong)bVar11 * auVar63._16_8_ | (ulong)!bVar11 * auVar61._16_8_;
                bVar11 = (bool)((byte)(uVar38 >> 3) & 1);
                auVar67._24_8_ = (ulong)bVar11 * auVar63._24_8_ | (ulong)!bVar11 * auVar61._24_8_;
                bVar11 = (bool)((byte)(uVar38 >> 4) & 1);
                auVar67._32_8_ = (ulong)bVar11 * auVar63._32_8_ | (ulong)!bVar11 * auVar61._32_8_;
                bVar11 = (bool)((byte)(uVar38 >> 5) & 1);
                auVar67._40_8_ = (ulong)bVar11 * auVar63._40_8_ | (ulong)!bVar11 * auVar61._40_8_;
                bVar11 = (bool)((byte)(uVar38 >> 6) & 1);
                auVar67._48_8_ = (ulong)bVar11 * auVar63._48_8_ | (ulong)!bVar11 * auVar61._48_8_;
                auVar67._56_8_ =
                     (uVar38 >> 7) * auVar63._56_8_ | (ulong)!SUB81(uVar38 >> 7,0) * auVar61._56_8_;
                *pauVar31 = auVar67;
              }
              if (uVar37 < 3) {
                uVar42 = (ulong)(uVar37 << 3);
                auVar55 = vpbroadcastq_avx512vl();
                uVar38 = vpcmpuq_avx512vl(auVar55,_DAT_00955380,5);
                uVar38 = uVar38 & 0xf;
                bVar10 = (byte)uVar38;
                plVar1 = (long *)(*pauVar31 + uVar42);
                auVar55 = *(undefined1 (*) [32])(*pauVar31 + uVar42);
                auVar56._0_8_ =
                     (ulong)(bVar10 & 1) *
                     (long)((double)((ulong)(bVar10 & 1) *
                                    *(long *)((long)local_2b8.m_data + uVar42)) +
                           (double)((ulong)(bVar10 & 1) * *plVar1)) |
                     (ulong)!(bool)(bVar10 & 1) * auVar55._0_8_;
                bVar11 = (bool)((byte)(uVar38 >> 1) & 1);
                auVar56._8_8_ =
                     (ulong)bVar11 *
                     (long)((double)((ulong)((byte)(uVar38 >> 1) & 1) *
                                    *(long *)((long)local_2b8.m_data + uVar42 + 8)) +
                           (double)((ulong)((byte)(uVar38 >> 1) & 1) * plVar1[1])) |
                     (ulong)!bVar11 * auVar55._8_8_;
                bVar11 = (bool)((byte)(uVar38 >> 2) & 1);
                auVar56._16_8_ =
                     (ulong)bVar11 *
                     (long)((double)((ulong)((byte)(uVar38 >> 2) & 1) *
                                    *(long *)((long)local_2b8.m_data + uVar42 + 0x10)) +
                           (double)((ulong)((byte)(uVar38 >> 2) & 1) * plVar1[2])) |
                     (ulong)!bVar11 * auVar55._16_8_;
                auVar56._24_8_ =
                     (uVar38 >> 3) *
                     (long)((double)((uVar38 >> 3) *
                                    *(long *)((long)local_2b8.m_data + uVar42 + 0x18)) +
                           (double)((uVar38 >> 3) * plVar1[3])) |
                     (ulong)!SUB81(uVar38 >> 3,0) * auVar55._24_8_;
                *(undefined1 (*) [32])(*pauVar31 + uVar42) = auVar56;
              }
              uVar39 = uVar39 + 1;
            } while (uVar39 < (ulong)((long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4));
          }
          std::
          vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
          ::~vector(&local_98);
          if ((double *)local_2f8._0_8_ != (double *)0x0) {
            free(*(void **)(local_2f8._0_8_ + -8));
          }
          dVar47 = (double)((long)dVar47 + 1);
        } while ((long)dVar47 < (long)this->int_order_b);
        bVar11 = 0 < this->int_order_b;
      }
      if (add_gyroscopic_terms != '\0') {
        if (lumped_mass == '\x01') {
          local_1c8.m_data[2] = 0.0;
          local_278.m_data[2] = 0.0;
          local_1c8.m_data[0] = 0.0;
          local_1c8.m_data[1] = 0.0;
          local_278.m_data[0] = 0.0;
          local_278.m_data[1] = 0.0;
          lVar28 = (long)(this->nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar28 != 0) {
            lVar45 = 0x18;
            lVar33 = 0;
            uVar39 = 0;
            auVar54 = vcvtusi2sd_avx512f(auVar54,lVar28 >> 4);
            local_2d8._0_8_ = (this->super_ChElementBeam).length / auVar54._0_8_;
            local_2d8._8_8_ = 0;
            _local_f8 = vbroadcastsd_avx512f(local_2d8);
            do {
              peVar6 = (this->section).
                       super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              peVar8 = (peVar6->inertia).
                       super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              p_Var46 = (peVar6->inertia).
                        super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var46 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var46->_M_use_count = p_Var46->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var46->_M_use_count = p_Var46->_M_use_count + 1;
                }
              }
              local_2c8._0_8_ = lVar33;
              dVar47 = (double)(uVar39 * 6 + 3);
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
                   = (double)((local_190->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + uVar39 * 6 + 3);
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
                   = (double)(local_190->super_ChVectorDynamic<double>).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows;
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
                   = 1.48219693752374e-323;
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
                   = (double)local_190;
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
                   = dVar47;
              if ((long)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[6] - 3U) < (long)dVar47) {
LAB_0068cc5a:
                __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                              ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                              "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                             );
              }
              ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                        ((ChVector<double> *)&local_2b8,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_218,(type *)0x0);
              (*peVar8->_vptr_ChInertiaCosserat[5])(peVar8,&local_1c8,&local_278,&local_2b8);
              if (p_Var46 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var46);
              }
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
                   = (double)(state_x->super_ChVectorDynamic<double>).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows;
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
                   = (double)((state_x->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + uVar39 * 7 + 3);
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
                   = (double)(uVar39 * 7 + 3);
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
                   = 1.97626258336499e-323;
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
                   = (double)state_x;
              if ((long)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[6] - 4U) <
                  (long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[4]) goto LAB_0068cc5a;
              ChQuaternion<double>::
              ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                        (&local_2b8,
                         (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                          *)&local_218,(type *)0x0);
              auVar51 = ZEXT816(0xbff0000000000000);
              auVar52 = ZEXT816(0x4000000000000000);
              auVar246._8_8_ = 0;
              auVar246._0_8_ = local_1c8.m_data[0];
              auVar259._8_8_ = 0;
              auVar259._0_8_ = local_1c8.m_data[2];
              dVar74 = local_2b8.m_data[0] * local_2b8.m_data[0];
              dVar233 = local_2b8.m_data[1] * local_2b8.m_data[2] -
                        local_2b8.m_data[0] * local_2b8.m_data[3];
              dVar127 = local_2b8.m_data[1] * local_2b8.m_data[2] +
                        local_2b8.m_data[0] * local_2b8.m_data[3];
              auVar184._8_8_ = 0;
              auVar184._0_8_ = dVar74 + local_2b8.m_data[2] * local_2b8.m_data[2];
              auVar54 = vfmadd213sd_fma(auVar184,auVar52,auVar51);
              auVar149._8_8_ = 0;
              auVar149._0_8_ = dVar74 + local_2b8.m_data[1] * local_2b8.m_data[1];
              auVar50 = vfmadd213sd_fma(auVar149,auVar52,auVar51);
              auVar136._8_8_ = 0;
              auVar136._0_8_ = dVar74 + local_2b8.m_data[3] * local_2b8.m_data[3];
              auVar51 = vfmadd213sd_fma(auVar136,auVar52,auVar51);
              auVar201._8_8_ = 0;
              auVar201._0_8_ = local_1c8.m_data[1] * (dVar233 + dVar233);
              auVar50 = vfmadd231sd_fma(auVar201,auVar246,auVar50);
              dVar74 = local_2b8.m_data[0] * local_2b8.m_data[2] +
                       local_2b8.m_data[1] * local_2b8.m_data[3];
              dVar233 = local_2b8.m_data[1] * local_2b8.m_data[3] -
                        local_2b8.m_data[0] * local_2b8.m_data[2];
              auVar90._8_8_ = 0;
              auVar90._0_8_ = dVar127 + dVar127;
              auVar185._8_8_ = 0;
              auVar185._0_8_ = local_1c8.m_data[1] * auVar54._0_8_;
              auVar52 = vfmadd231sd_fma(auVar185,auVar246,auVar90);
              dVar98 = local_2b8.m_data[2] * local_2b8.m_data[3] -
                       local_2b8.m_data[0] * local_2b8.m_data[1];
              dVar127 = local_2b8.m_data[0] * local_2b8.m_data[1] +
                        local_2b8.m_data[2] * local_2b8.m_data[3];
              auVar150._8_8_ = 0;
              auVar150._0_8_ = dVar74 + dVar74;
              auVar54 = vfmadd213sd_fma(auVar150,auVar259,auVar50);
              auVar91._8_8_ = 0;
              auVar91._0_8_ = dVar98 + dVar98;
              auVar50 = vfmadd213sd_fma(auVar91,auVar259,auVar52);
              auVar118._8_8_ = 0;
              auVar118._0_8_ = dVar233 + dVar233;
              auVar168._8_8_ = 0;
              auVar168._0_8_ = local_1c8.m_data[1] * (dVar127 + dVar127);
              auVar52 = vfmadd231sd_fma(auVar168,auVar246,auVar118);
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
                   = (double)auVar54._0_8_;
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
                   = auVar50._0_8_;
              auVar51 = vfmadd213sd_fma(auVar51,auVar259,auVar52);
              local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
                   = auVar51._0_8_;
              lVar28 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_rows + -3;
              if (lVar28 < (long)(uVar39 * 6)) goto LAB_0068cc5a;
              pdVar43 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              uVar37 = 3;
              pauVar31 = (undefined1 (*) [64])(pdVar43 + uVar39 * 6);
              if (((ulong)pauVar31 & 7) == 0) {
                uVar36 = -((uint)((ulong)pauVar31 >> 3) & 0x1fffffff) & 7;
                if (uVar36 < 3) {
                  uVar37 = uVar36;
                }
                if (uVar36 != 0) goto LAB_0068bec8;
              }
              else {
LAB_0068bec8:
                auVar275 = vpbroadcastq_avx512f();
                uVar38 = vpcmpuq_avx512f(auVar275,_DAT_009825c0,5);
                bVar10 = (byte)uVar38;
                auVar68._8_8_ = (ulong)((byte)(uVar38 >> 1) & 1) * (long)auVar50._0_8_;
                auVar68._0_8_ = (ulong)(bVar10 & 1) * (long)auVar54._0_8_;
                auVar68._16_8_ = (ulong)((byte)(uVar38 >> 2) & 1) * (long)auVar51._0_8_;
                auVar68._24_8_ =
                     (ulong)((byte)(uVar38 >> 3) & 1) *
                     (long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[3];
                auVar68._32_8_ =
                     (ulong)((byte)(uVar38 >> 4) & 1) *
                     (long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[4];
                auVar68._40_8_ =
                     (ulong)((byte)(uVar38 >> 5) & 1) *
                     (long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[5];
                auVar68._48_8_ =
                     (ulong)((byte)(uVar38 >> 6) & 1) *
                     (long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[6];
                auVar68._56_8_ =
                     (uVar38 >> 7) *
                     (long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array[7];
                auVar69._8_8_ =
                     (ulong)((byte)(uVar38 >> 1) & 1) * (long)*(double *)((long)*pauVar31 + 8);
                auVar69._0_8_ = (ulong)(bVar10 & 1) * (long)*(double *)*pauVar31;
                auVar69._16_8_ =
                     (ulong)((byte)(uVar38 >> 2) & 1) * (long)*(double *)((long)*pauVar31 + 0x10);
                auVar69._24_8_ =
                     (ulong)((byte)(uVar38 >> 3) & 1) * (long)*(double *)((long)*pauVar31 + 0x18);
                auVar69._32_8_ =
                     (ulong)((byte)(uVar38 >> 4) & 1) * (long)*(double *)((long)*pauVar31 + 0x20);
                auVar69._40_8_ =
                     (ulong)((byte)(uVar38 >> 5) & 1) * (long)*(double *)((long)*pauVar31 + 0x28);
                auVar69._48_8_ =
                     (ulong)((byte)(uVar38 >> 6) & 1) * (long)*(double *)((long)*pauVar31 + 0x30);
                auVar69._56_8_ = (uVar38 >> 7) * (long)*(double *)((long)*pauVar31 + 0x38);
                auVar275 = vmulpd_avx512f(auVar68,_local_f8);
                auVar275 = vsubpd_avx512f(auVar69,auVar275);
                auVar70._0_8_ =
                     (ulong)(bVar10 & 1) * auVar275._0_8_ |
                     (ulong)!(bool)(bVar10 & 1) * (long)*(double *)*pauVar31;
                bVar11 = (bool)((byte)(uVar38 >> 1) & 1);
                auVar70._8_8_ =
                     (ulong)bVar11 * auVar275._8_8_ |
                     (ulong)!bVar11 * (long)*(double *)((long)*pauVar31 + 8);
                bVar11 = (bool)((byte)(uVar38 >> 2) & 1);
                auVar70._16_8_ =
                     (ulong)bVar11 * auVar275._16_8_ |
                     (ulong)!bVar11 * (long)*(double *)((long)*pauVar31 + 0x10);
                bVar11 = (bool)((byte)(uVar38 >> 3) & 1);
                auVar70._24_8_ =
                     (ulong)bVar11 * auVar275._24_8_ |
                     (ulong)!bVar11 * (long)*(double *)((long)*pauVar31 + 0x18);
                bVar11 = (bool)((byte)(uVar38 >> 4) & 1);
                auVar70._32_8_ =
                     (ulong)bVar11 * auVar275._32_8_ |
                     (ulong)!bVar11 * (long)*(double *)((long)*pauVar31 + 0x20);
                bVar11 = (bool)((byte)(uVar38 >> 5) & 1);
                auVar70._40_8_ =
                     (ulong)bVar11 * auVar275._40_8_ |
                     (ulong)!bVar11 * (long)*(double *)((long)*pauVar31 + 0x28);
                bVar11 = (bool)((byte)(uVar38 >> 6) & 1);
                auVar70._48_8_ =
                     (ulong)bVar11 * auVar275._48_8_ |
                     (ulong)!bVar11 * (long)*(double *)((long)*pauVar31 + 0x30);
                auVar70._56_8_ =
                     (uVar38 >> 7) * auVar275._56_8_ |
                     (ulong)!SUB81(uVar38 >> 7,0) * (long)*(double *)((long)*pauVar31 + 0x38);
                *pauVar31 = auVar70;
              }
              if (uVar37 < 3) {
                uVar42 = (ulong)(uVar37 << 3);
                auVar55 = vpbroadcastq_avx512vl();
                uVar38 = vpcmpuq_avx512vl(auVar55,_DAT_00955380,5);
                uVar38 = uVar38 & 0xf;
                bVar10 = (byte)uVar38;
                plVar1 = (long *)((long)*pauVar31 + uVar42);
                auVar55._8_8_ = (ulong)((byte)(uVar38 >> 1) & 1) * plVar1[1];
                auVar55._0_8_ = (ulong)(bVar10 & 1) * *plVar1;
                auVar55._16_8_ = (ulong)((byte)(uVar38 >> 2) & 1) * plVar1[2];
                auVar55._24_8_ = (uVar38 >> 3) * plVar1[3];
                auVar97._0_8_ =
                     (double)((ulong)(bVar10 & 1) *
                             *(long *)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                             .m_storage.m_data.array + uVar42)) * (double)local_f8;
                auVar97._8_8_ =
                     (double)((ulong)((byte)(uVar38 >> 1) & 1) *
                             *(long *)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                             .m_storage.m_data.array + uVar42 + 8)) *
                     (double)auStack_f0._0_8_;
                auVar97._16_8_ =
                     (double)((ulong)((byte)(uVar38 >> 2) & 1) *
                             *(long *)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                             .m_storage.m_data.array + uVar42 + 0x10)) *
                     (double)auStack_f0._8_8_;
                auVar97._24_8_ =
                     (double)((uVar38 >> 3) *
                             *(long *)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                             .m_storage.m_data.array + uVar42 + 0x18)) * dStack_e0;
                auVar55 = vsubpd_avx(auVar55,auVar97);
                pauVar2 = (undefined1 (*) [32])((long)*pauVar31 + uVar42);
                auVar57._0_8_ =
                     (ulong)(bVar10 & 1) * auVar55._0_8_ |
                     (ulong)!(bool)(bVar10 & 1) * *(long *)*pauVar2;
                bVar11 = (bool)((byte)(uVar38 >> 1) & 1);
                auVar57._8_8_ =
                     (ulong)bVar11 * auVar55._8_8_ | (ulong)!bVar11 * *(long *)(*pauVar2 + 8);
                bVar11 = (bool)((byte)(uVar38 >> 2) & 1);
                auVar57._16_8_ =
                     (ulong)bVar11 * auVar55._16_8_ | (ulong)!bVar11 * *(long *)(*pauVar2 + 0x10);
                auVar57._24_8_ =
                     (uVar38 >> 3) * auVar55._24_8_ |
                     (ulong)!SUB81(uVar38 >> 3,0) * *(long *)(*pauVar2 + 0x18);
                *pauVar2 = auVar57;
              }
              if (lVar28 < (long)dVar47) goto LAB_0068cc5a;
              uVar38 = 3;
              if (((ulong)(pdVar43 + (long)dVar47) & 7) == 0) {
                uVar37 = -((uint)((ulong)(pdVar43 + (long)dVar47) >> 3) & 0x1fffffff) & 7;
                if ((ulong)uVar37 < 3) {
                  uVar38 = (ulong)uVar37;
                }
                if (uVar37 != 0) goto LAB_0068bf81;
              }
              else {
LAB_0068bf81:
                uVar42 = 0;
                do {
                  *(double *)((long)pdVar43 + uVar42 * 8 + lVar45) =
                       *(double *)((long)pdVar43 + uVar42 * 8 + lVar45) -
                       (double)local_2d8._0_8_ * local_278.m_data[uVar42];
                  uVar42 = uVar42 + 1;
                } while (uVar38 != uVar42);
              }
              if (uVar38 < 3) {
                lVar28 = uVar38 + 3;
                do {
                  *(double *)((long)pdVar43 + lVar28 * 8 + local_2c8._0_8_) =
                       *(double *)((long)pdVar43 + lVar28 * 8 + local_2c8._0_8_) -
                       (double)local_2d8._0_8_ * (&dStack_290)[lVar28];
                  lVar28 = lVar28 + 1;
                } while (lVar28 != 6);
              }
              uVar39 = uVar39 + 1;
              lVar45 = lVar45 + 0x30;
              lVar33 = local_2c8._0_8_ + 0x30;
            } while (uVar39 < (ulong)((long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4));
          }
        }
        else {
          local_1c8.m_data[2] = 0.0;
          local_278.m_data[2] = 0.0;
          local_1c8.m_data[0] = 0.0;
          local_1c8.m_data[1] = 0.0;
          local_278.m_data[0] = 0.0;
          local_278.m_data[1] = 0.0;
          if (bVar11) {
            lVar28 = 0;
            do {
              pCVar29 = ChQuadrature::GetStaticTables();
              auVar92._8_8_ = 0;
              auVar92._0_8_ = local_118;
              auVar119._8_8_ = 0;
              auVar119._0_8_ =
                   *(ulong *)(*(long *)&(pCVar29->Lroots).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start
                                        [(long)this->int_order_b + -1].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data + lVar28 * 8);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = local_198;
              auVar54 = vfmadd132sd_fma(auVar119,auVar92,auVar3);
              pCVar29 = ChQuadrature::GetStaticTables();
              iVar4 = this->order;
              local_248 = *(double *)
                           (*(long *)&(pCVar29->Weight).
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [(long)this->int_order_b + -1].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl +
                           lVar28 * 8);
              local_138 = (this->Jacobian_b).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar28];
              local_2e8 = 0;
              lVar33 = (long)(int)((ulong)((long)(this->nodes).
                                                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->nodes).
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
              local_2f8 = ZEXT816(0);
              if (lVar33 < 0) {
LAB_0068cc7c:
                local_2e8 = 0;
                __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                              ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                              "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                             );
              }
              Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                        ((DenseStorage<double,__1,__1,__1,_1> *)local_2f8,lVar33,1,lVar33);
              geometry::ChBasisToolsBspline::BasisEvaluateDeriv
                        (this->order,iVar4,auVar54._0_8_,local_120,(ChMatrixDynamic<> *)local_2f8);
              psVar30 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              psVar32 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_330 = VNULL;
              local_318 = DAT_00b689a0;
              local_320 = DAT_00b689a8;
              if (psVar30 != psVar32) {
                lVar33 = 0x18;
                dVar47 = 1.48219693752374e-323;
                uVar39 = 0;
                do {
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[6] = (double)(state_x->super_ChVectorDynamic<double>).
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_rows;
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0] = (double)((long)(state_x->super_ChVectorDynamic<double>).
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_data + lVar33);
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] = 1.97626258336499e-323;
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3] = (double)state_x;
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4] = dVar47;
                  if ((long)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array[6] - 4U) < (long)dVar47)
                  goto LAB_0068cc5a;
                  ChQuaternion<double>::
                  ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                            (&local_2b8,
                             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                              *)&local_218,(type *)0x0);
                  auVar206._8_8_ = 0;
                  auVar206._0_8_ = local_2b8.m_data[0];
                  auVar219._8_8_ = 0;
                  auVar219._0_8_ = local_2b8.m_data[2];
                  auVar247._8_8_ = 0;
                  auVar247._0_8_ = local_2b8.m_data[1];
                  auVar120._8_8_ = 0;
                  auVar120._0_8_ = local_2b8.m_data[3];
                  dVar49 = 1.0;
                  dVar98 = 0.0;
                  dVar233 = 0.0;
                  dVar74 = 0.0;
                  peVar5 = (((this->nodes).
                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr;
                  auVar202._8_8_ = 0;
                  auVar202._0_8_ = *(double *)&peVar5->field_0x48;
                  dVar127 = *(double *)&peVar5->field_0x40;
                  auVar227._8_8_ = 0;
                  auVar227._0_8_ = dVar127;
                  auVar186._8_8_ = 0;
                  auVar186._0_8_ = *(ulong *)&peVar5->field_0x38;
                  auVar169._8_8_ = 0;
                  auVar169._0_8_ = *(double *)&peVar5->field_0x50;
                  auVar265._8_8_ = 0;
                  auVar265._0_8_ = local_2b8.m_data[0] * *(double *)&peVar5->field_0x48;
                  auVar54 = vfmsub231sd_fma(auVar265,auVar186,auVar219);
                  auVar260._8_8_ = 0;
                  auVar260._0_8_ = dVar127 * local_2b8.m_data[0];
                  auVar50 = vfmsub231sd_fma(auVar260,auVar186,auVar247);
                  auVar271._8_8_ = 0;
                  auVar271._0_8_ = local_2b8.m_data[0] * *(double *)&peVar5->field_0x50;
                  auVar51 = vfmsub231sd_fma(auVar271,auVar186,auVar120);
                  auVar52 = vfnmadd231sd_fma(auVar54,auVar169,auVar247);
                  auVar54 = vfmadd231sd_fma(auVar50,auVar169,auVar219);
                  auVar50 = vfmadd231sd_fma(auVar51,auVar202,auVar247);
                  auVar51 = vfmadd231sd_fma(auVar52,auVar227,auVar120);
                  auVar52 = vfnmadd231sd_fma(auVar54,auVar202,auVar120);
                  auVar50 = vfnmadd231sd_fma(auVar50,auVar227,auVar219);
                  dVar157 = auVar51._0_8_;
                  auVar254._8_8_ = 0;
                  auVar254._0_8_ = dVar157 * dVar157;
                  auVar54 = vfmadd231sd_fma(auVar254,auVar52,auVar52);
                  auVar54 = vfmadd231sd_fma(auVar54,auVar50,auVar50);
                  if (0.0 < auVar54._0_8_) {
                    local_f8 = (undefined1  [8])auVar52._0_8_;
                    local_2d8._0_8_ = dVar157;
                    local_2c8._0_8_ = auVar50._0_8_;
                    auVar93._8_8_ = 0;
                    auVar93._0_8_ = dVar127 * local_2b8.m_data[1];
                    auVar50 = vfmadd213sd_fma(auVar206,auVar186,auVar93);
                    auVar54 = vsqrtsd_avx(auVar54,auVar54);
                    auVar50 = vfmadd213sd_fma(auVar219,auVar202,auVar50);
                    auVar50 = vfmadd213sd_fma(auVar120,auVar169,auVar50);
                    dVar74 = atan2(auVar54._0_8_,auVar50._0_8_);
                    dVar74 = dVar74 + dVar74;
                    dVar98 = 1.0 / auVar54._0_8_;
                    dVar127 = dVar98 * (double)local_2d8._0_8_;
                    auVar137._8_8_ = 0;
                    auVar137._0_8_ = dVar98 * (double)local_f8;
                    auVar170._8_8_ = 0;
                    auVar170._0_8_ = dVar127 * dVar127;
                    auVar54 = vfmadd231sd_fma(auVar170,auVar137,auVar137);
                    auVar121._8_8_ = 0;
                    auVar121._0_8_ = dVar98 * (double)local_2c8._0_8_;
                    auVar54 = vfmadd231sd_fma(auVar54,auVar121,auVar121);
                    auVar54 = vsqrtsd_avx(auVar54,auVar54);
                    dVar156 = 1.0 / auVar54._0_8_;
                    bVar11 = 2.2250738585072014e-308 <= auVar54._0_8_;
                    dVar233 = (double)((ulong)bVar11 *
                                      (long)(dVar98 * (double)local_2c8._0_8_ * dVar156));
                    dVar157 = -6.283185307179586;
                    dVar49 = (double)((ulong)bVar11 * (long)(dVar98 * (double)local_f8 * dVar156) +
                                     (ulong)!bVar11 * 0x3ff0000000000000);
                    dVar98 = (double)((ulong)bVar11 * (long)(dVar127 * dVar156));
                    if ((3.141592653589793 < dVar74) ||
                       (dVar157 = 6.283185307179586, dVar74 < -3.141592653589793)) {
                      dVar74 = dVar74 + dVar157;
                    }
                  }
                  if (((long)local_2f8._8_8_ < 1) || (local_2e8 <= (long)uVar39)) goto LAB_0068cc38;
                  lVar33 = lVar33 + 0x38;
                  dVar47 = (double)((long)dVar47 + 7);
                  dVar127 = *(double *)(local_2f8._0_8_ + uVar39 * 8);
                  psVar32 = (this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  psVar30 = (this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  uVar39 = uVar39 + 1;
                  local_330 = local_330 + dVar49 * dVar74 * dVar127;
                  local_318 = local_318 + dVar98 * dVar74 * dVar127;
                  local_320 = local_320 + dVar233 * dVar74 * dVar127;
                } while (uVar39 < (ulong)((long)psVar30 - (long)psVar32 >> 4));
              }
              auVar122._8_8_ = 0;
              auVar122._0_8_ = local_330;
              auVar94._8_8_ = 0;
              auVar94._0_8_ = local_318 * local_318;
              auVar54 = vfmadd231sd_fma(auVar94,auVar122,auVar122);
              auVar123._8_8_ = 0;
              auVar123._0_8_ = local_320;
              auVar54 = vfmadd231sd_fma(auVar54,auVar123,auVar123);
              local_2c8._0_8_ = 0x3fe0000000000000;
              dVar47 = 1.0;
              if (1e-30 < auVar54._0_8_) {
                auVar54 = vsqrtsd_avx(auVar54,auVar54);
                local_2c8._0_8_ = auVar54._0_8_;
                local_2d8._0_8_ = (double)local_2c8._0_8_ * 0.5;
                dVar47 = sin((double)local_2d8._0_8_);
                local_2c8._0_8_ = dVar47 / (double)local_2c8._0_8_;
                dVar47 = cos((double)local_2d8._0_8_);
                psVar32 = (this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                psVar30 = (this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              peVar5 = (psVar32->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
              local_f8 = (undefined1  [8])dVar47;
              local_2d8._0_8_ = lVar28;
              local_2e0 = *(double *)&peVar5->field_0x38;
              dVar47 = *(double *)&peVar5->field_0x40;
              local_240 = *(double *)&peVar5->field_0x48;
              local_250 = *(double *)&peVar5->field_0x50;
              local_238.m_data[2] = 0.0;
              local_238.m_data._0_16_ = ZEXT816(0);
              if (psVar30 == psVar32) {
                auVar96 = ZEXT816(0);
                dVar127 = 0.0;
                auVar125 = ZEXT816(0) << 0x40;
              }
              else {
                lVar28 = 0x18;
                dVar233 = 1.48219693752374e-323;
                dVar74 = 1.48219693752374e-323;
                lVar33 = 0x18;
                uVar39 = 0;
                do {
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[6] = (double)(state_x->super_ChVectorDynamic<double>).
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_rows;
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0] = (double)((long)(state_x->super_ChVectorDynamic<double>).
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_data + lVar33);
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] = 1.97626258336499e-323;
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3] = (double)state_x;
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4] = dVar74;
                  if ((long)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array[6] - 4U) < (long)dVar74)
                  goto LAB_0068cc5a;
                  ChQuaternion<double>::
                  ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                            (&local_2b8,
                             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                              *)&local_218,(type *)0x0);
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[6] = (double)(local_190->super_ChVectorDynamic<double>).
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_rows;
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0] = (double)((long)(local_190->super_ChVectorDynamic<double>).
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            .m_storage.m_data + lVar28);
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] = 1.48219693752374e-323;
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3] = (double)local_190;
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4] = dVar233;
                  if ((long)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array[6] - 3U) < (long)dVar233)
                  goto LAB_0068cc5a;
                  ChVector<double>::
                  ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                            (&local_b8,
                             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                              *)&local_218,(type *)0x0);
                  if (((long)local_2f8._8_8_ < 1) || (local_2e8 <= (long)uVar39)) goto LAB_0068cc38;
                  auVar52 = ZEXT816(0xbff0000000000000);
                  auVar237._8_8_ = 0;
                  auVar237._0_8_ = local_b8.m_data[0];
                  auVar187._8_8_ = 0;
                  auVar187._0_8_ = local_b8.m_data[2];
                  lVar33 = lVar33 + 0x38;
                  dVar74 = (double)((long)dVar74 + 7);
                  lVar28 = lVar28 + 0x30;
                  dVar233 = (double)((long)dVar233 + 6);
                  dVar98 = local_2b8.m_data[0] * local_2b8.m_data[0];
                  dVar127 = local_2b8.m_data[0] * local_2b8.m_data[1] +
                            local_2b8.m_data[3] * local_2b8.m_data[2];
                  dVar49 = local_2b8.m_data[3] * local_2b8.m_data[1] -
                           local_2b8.m_data[0] * local_2b8.m_data[2];
                  auVar171._8_8_ = 0;
                  auVar171._0_8_ = dVar98 + local_2b8.m_data[3] * local_2b8.m_data[3];
                  auVar50 = vfmadd213sd_avx512f(auVar171,ZEXT816(0x4000000000000000),auVar52);
                  auVar228._8_8_ = 0;
                  auVar228._0_8_ = dVar49 + dVar49;
                  auVar266._8_8_ = 0;
                  auVar266._0_8_ = local_b8.m_data[1] * (dVar127 + dVar127);
                  auVar54 = vfmadd231sd_fma(auVar266,auVar237,auVar228);
                  auVar54 = vfmadd231sd_fma(auVar54,auVar187,auVar50);
                  dVar49 = local_2b8.m_data[3] * local_2b8.m_data[2] -
                           local_2b8.m_data[0] * local_2b8.m_data[1];
                  dVar127 = local_2b8.m_data[1] * local_2b8.m_data[2] +
                            local_2b8.m_data[0] * local_2b8.m_data[3];
                  dVar157 = local_2b8.m_data[1] * local_2b8.m_data[2] -
                            local_2b8.m_data[0] * local_2b8.m_data[3];
                  auVar207._8_8_ = 0;
                  auVar207._0_8_ = dVar98 + local_2b8.m_data[2] * local_2b8.m_data[2];
                  auVar51 = vfmadd213sd_avx512f(auVar207,ZEXT816(0x4000000000000000),auVar52);
                  auVar124._8_8_ = 0;
                  auVar124._0_8_ = dVar98 + local_2b8.m_data[1] * local_2b8.m_data[1];
                  auVar50 = vfmadd213sd_avx512f(auVar124,ZEXT816(0x4000000000000000),auVar52);
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = local_b8.m_data[1] * (dVar157 + dVar157);
                  auVar50 = vfmadd231sd_fma(auVar95,auVar237,auVar50);
                  dVar98 = *(double *)(local_2f8._0_8_ + uVar39 * 8);
                  uVar39 = uVar39 + 1;
                  auVar151._8_8_ = 0;
                  auVar151._0_8_ = dVar127 + dVar127;
                  auVar208._8_8_ = 0;
                  auVar208._0_8_ = local_b8.m_data[1] * auVar51._0_8_;
                  auVar51 = vfmadd231sd_fma(auVar208,auVar237,auVar151);
                  dVar127 = local_2b8.m_data[0] * local_2b8.m_data[2] +
                            local_2b8.m_data[3] * local_2b8.m_data[1];
                  auVar172._8_8_ = 0;
                  auVar172._0_8_ = dVar49 + dVar49;
                  auVar51 = vfmadd231sd_fma(auVar51,auVar187,auVar172);
                  auVar152._8_8_ = 0;
                  auVar152._0_8_ = dVar127 + dVar127;
                  auVar50 = vfmadd231sd_fma(auVar50,auVar187,auVar152);
                  dVar49 = dVar98 * auVar50._0_8_ + local_238.m_data[0];
                  auVar125._8_8_ = 0;
                  auVar125._0_8_ = dVar49;
                  dVar127 = dVar98 * auVar51._0_8_ + local_238.m_data[1];
                  local_238.m_data[1] = dVar127;
                  local_238.m_data[0] = dVar49;
                  local_238.m_data[2] = auVar54._0_8_ * dVar98 + local_238.m_data[2];
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = local_238.m_data[2];
                } while (uVar39 < (ulong)((long)(this->nodes).
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->nodes).
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4));
              }
              pCVar27 = local_1a0;
              auVar209._8_8_ = 0;
              auVar209._0_8_ = dVar47;
              auVar203._8_8_ = 0;
              auVar203._0_8_ = local_f8;
              auVar220._8_8_ = 0;
              auVar220._0_8_ = local_2e0;
              auVar229._8_8_ = 0;
              auVar229._0_8_ = local_240;
              auVar238._8_8_ = 0;
              auVar238._0_8_ = local_250;
              uVar26 = local_2d8._0_8_;
              auVar173._8_8_ = 0;
              auVar173._0_8_ = (double)local_2c8._0_8_ * local_330;
              auVar255._8_8_ = 0;
              auVar255._0_8_ = (double)local_f8 * dVar47;
              auVar54 = vfmadd231sd_fma(auVar255,auVar220,auVar173);
              auVar188._8_8_ = 0;
              auVar188._0_8_ = (double)local_2c8._0_8_ * local_318;
              auVar261._8_8_ = 0;
              auVar261._0_8_ = local_240 * (double)local_f8;
              auVar50 = vfmadd231sd_fma(auVar261,auVar220,auVar188);
              auVar248._8_8_ = 0;
              auVar248._0_8_ = (double)local_2c8._0_8_ * local_330 * dVar47;
              auVar51 = vfmsub231sd_fma(auVar248,auVar220,auVar203);
              auVar52 = vfnmadd231sd_fma(auVar54,auVar238,auVar188);
              auVar54 = vfmadd231sd_fma(auVar50,auVar238,auVar173);
              auVar189._8_8_ = 0;
              auVar189._0_8_ = (double)local_2c8._0_8_ * local_318;
              auVar50 = vfnmadd231sd_fma(auVar51,auVar229,auVar189);
              auVar153._8_8_ = 0;
              auVar153._0_8_ = (double)local_2c8._0_8_ * local_320;
              auVar51 = vfnmadd231sd_fma(auVar54,auVar209,auVar153);
              auVar54 = vfmadd231sd_fma(auVar52,auVar229,auVar153);
              auVar154._8_8_ = 0;
              auVar154._0_8_ = (double)local_2c8._0_8_ * local_320;
              local_2c8 = vfnmadd231sd_fma(auVar50,auVar238,auVar154);
              dVar47 = local_250 * (double)local_f8;
              dVar49 = auVar54._0_8_;
              dVar157 = auVar51._0_8_;
              local_148 = dVar49 * dVar157;
              local_f8 = (undefined1  [8])dVar49;
              auVar239._8_8_ = 0;
              auVar239._0_8_ = dVar47;
              auVar50 = vfmadd231sd_fma(auVar239,auVar220,auVar154);
              dVar233 = local_2c8._0_8_ * local_2c8._0_8_;
              auVar50 = vfnmadd231sd_fma(auVar50,auVar229,auVar173);
              auVar50 = vfmadd231sd_fma(auVar50,auVar209,auVar189);
              auVar15._8_8_ = 0x8000000000000000;
              auVar15._0_8_ = 0x8000000000000000;
              auVar51 = vxorpd_avx512vl(local_2c8,auVar15);
              auVar158 = ZEXT816(0xbff0000000000000);
              auVar53 = vmulsd_avx512f(auVar54,auVar50);
              local_2e0 = auVar50._0_8_;
              local_240 = dVar157 * local_2e0;
              vmovsd_avx512f(auVar53);
              dVar98 = auVar51._0_8_;
              auVar178 = ZEXT816(0x4000000000000000);
              dVar47 = local_148 - local_2e0 * dVar98;
              auVar230._8_8_ = 0;
              auVar230._0_8_ = dVar157 * dVar98;
              auVar51 = vaddsd_avx512f(auVar230,auVar53);
              auVar262._8_8_ = 0;
              auVar262._0_8_ = dVar233 + dVar49 * dVar49;
              auVar54 = vfmadd213sd_fma(auVar262,auVar178,auVar158);
              auVar174._8_8_ = 0;
              auVar174._0_8_ = (dVar47 + dVar47) * dVar127;
              auVar50 = vfmadd231sd_fma(auVar174,auVar54,auVar125);
              auVar240._8_8_ = 0;
              auVar240._0_8_ = auVar51._0_8_ + auVar51._0_8_;
              auVar50 = vfmadd213sd_fma(auVar240,auVar96,auVar50);
              dVar47 = local_148 + local_2e0 * dVar98;
              dVar74 = dVar49 * dVar98 + local_240;
              auVar267._8_8_ = 0;
              auVar267._0_8_ = dVar233 + dVar157 * dVar157;
              auVar51 = vfmadd213sd_fma(auVar267,auVar178,auVar158);
              auVar175._8_8_ = 0;
              auVar175._0_8_ = dVar47 + dVar47;
              auVar190._8_8_ = 0;
              auVar190._0_8_ = auVar51._0_8_ * dVar127;
              auVar52 = vfmadd231sd_fma(auVar190,auVar125,auVar175);
              dVar47 = local_240 - dVar49 * dVar98;
              auVar176._8_8_ = 0;
              auVar176._0_8_ = dVar47 + dVar47;
              auVar52 = vfmadd213sd_fma(auVar176,auVar96,auVar52);
              auVar53 = vsubsd_avx512f(auVar53,auVar230);
              local_238.m_data[1] = (double)auVar52._0_8_;
              local_238.m_data[0] = (double)auVar50._0_8_;
              auVar138._8_8_ = 0;
              auVar138._0_8_ = (dVar74 + dVar74) * dVar127;
              auVar191._8_8_ = 0;
              auVar191._0_8_ = auVar53._0_8_ + auVar53._0_8_;
              auVar52 = vfmadd231sd_fma(auVar138,auVar125,auVar191);
              auVar126._8_8_ = 0;
              auVar126._0_8_ = dVar233 + local_2e0 * local_2e0;
              auVar50 = vfmadd213sd_fma(auVar126,auVar178,auVar158);
              auVar52 = vfmadd231sd_fma(auVar52,auVar50,auVar96);
              local_238.m_data[2] = auVar52._0_8_;
              peVar6 = (this->section).
                       super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              peVar8 = (peVar6->inertia).
                       super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              p_Var46 = (peVar6->inertia).
                        super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (p_Var46 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var46->_M_use_count = p_Var46->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var46->_M_use_count = p_Var46->_M_use_count + 1;
                }
              }
              (*peVar8->_vptr_ChInertiaCosserat[5])(peVar8,&local_1c8,&local_278,&local_238);
              if (p_Var46 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var46);
              }
              auVar275 = _DAT_009825c0;
              auVar55 = _DAT_00955380;
              auVar272._8_8_ = 0;
              auVar272._0_8_ = auVar54._0_8_;
              lVar28 = (long)(this->nodes).
                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->nodes).
                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              if (lVar28 != 0) {
                if ((long)local_2f8._8_8_ < 1) {
LAB_0068cc38:
                  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                               );
                }
                pdVar9 = (pCVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data;
                lVar28 = lVar28 >> 4;
                dVar233 = local_138 * local_248 * local_198;
                lVar33 = (pCVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows + -3;
                pdVar43 = pdVar9 + 3;
                lVar45 = 0;
                dVar98 = local_148 - (double)local_2c8._0_8_ * local_2e0;
                dVar47 = local_250 + (double)local_2c8._0_8_ * dVar157;
                dVar127 = local_148 + (double)local_2c8._0_8_ * local_2e0;
                dVar49 = local_240 - (double)local_2c8._0_8_ * (double)local_f8;
                dVar157 = local_250 - (double)local_2c8._0_8_ * dVar157;
                dVar74 = (double)local_2c8._0_8_ * (double)local_f8 + local_240;
                do {
                  if (local_2e8 <= lVar45) goto LAB_0068cc38;
                  auVar231._8_8_ = 0;
                  auVar231._0_8_ = local_1c8.m_data[1];
                  auVar221._8_8_ = 0;
                  auVar221._0_8_ = local_1c8.m_data[0];
                  auVar249._8_8_ = 0;
                  auVar249._0_8_ = local_1c8.m_data[2];
                  dVar156 = dVar233 * *(double *)(local_2f8._0_8_ + lVar45 * 8);
                  auVar273._8_8_ = 0;
                  auVar273._0_8_ = auVar51._0_8_;
                  auVar52 = vmulsd_avx512f(auVar273,auVar231);
                  auVar241._8_8_ = 0;
                  auVar241._0_8_ = local_1c8.m_data[1] * (dVar98 + dVar98);
                  auVar54 = vfmadd231sd_fma(auVar241,auVar272,auVar221);
                  auVar155._8_8_ = 0;
                  auVar155._0_8_ = dVar127 + dVar127;
                  auVar52 = vfmadd231sd_fma(auVar52,auVar155,auVar221);
                  auVar192._8_8_ = 0;
                  auVar192._0_8_ = dVar157 + dVar157;
                  auVar232._8_8_ = 0;
                  auVar232._0_8_ = local_1c8.m_data[1] * (dVar74 + dVar74);
                  auVar53 = vfmadd231sd_fma(auVar232,auVar192,auVar221);
                  auVar139._8_8_ = 0;
                  auVar139._0_8_ = dVar47 + dVar47;
                  auVar54 = vfmadd231sd_fma(auVar54,auVar139,auVar249);
                  auVar177._8_8_ = 0;
                  auVar177._0_8_ = dVar49 + dVar49;
                  auVar52 = vfmadd231sd_fma(auVar52,auVar177,auVar249);
                  auVar274._8_8_ = 0;
                  auVar274._0_8_ = auVar50._0_8_;
                  auVar53 = vfmadd231sd_avx512f(auVar53,auVar274,auVar249);
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0] = (double)auVar54._0_8_;
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] = auVar52._0_8_;
                  local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[2] = auVar53._0_8_;
                  if (lVar33 < lVar45 * 6) goto LAB_0068cc5a;
                  pauVar31 = (undefined1 (*) [64])(pdVar9 + lVar45 * 6);
                  uVar37 = 3;
                  if (((ulong)pdVar9 & 7) == 0) {
                    uVar36 = -((uint)((ulong)pauVar31 >> 3) & 0x1fffffff) & 7;
                    if (uVar36 < 3) {
                      uVar37 = uVar36;
                    }
                    if (uVar36 != 0) goto LAB_0068cae8;
                  }
                  else {
LAB_0068cae8:
                    auVar210._8_8_ = 0;
                    auVar210._0_8_ = dVar156;
                    auVar61 = vbroadcastsd_avx512f(auVar210);
                    auVar63 = vpbroadcastq_avx512f();
                    uVar39 = vpcmpuq_avx512f(auVar63,auVar275,5);
                    bVar10 = (byte)uVar39;
                    auVar71._8_8_ = (ulong)((byte)(uVar39 >> 1) & 1) * (long)auVar52._0_8_;
                    auVar71._0_8_ = (ulong)(bVar10 & 1) * (long)auVar54._0_8_;
                    auVar71._16_8_ = (ulong)((byte)(uVar39 >> 2) & 1) * (long)auVar53._0_8_;
                    auVar71._24_8_ =
                         (ulong)((byte)(uVar39 >> 3) & 1) *
                         (long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[3];
                    auVar71._32_8_ =
                         (ulong)((byte)(uVar39 >> 4) & 1) *
                         (long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[4];
                    auVar71._40_8_ =
                         (ulong)((byte)(uVar39 >> 5) & 1) *
                         (long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[5];
                    auVar71._48_8_ =
                         (ulong)((byte)(uVar39 >> 6) & 1) *
                         (long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[6];
                    auVar71._56_8_ =
                         (uVar39 >> 7) *
                         (long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[7];
                    auVar72._8_8_ = (ulong)((byte)(uVar39 >> 1) & 1) * *(long *)(*pauVar31 + 8);
                    auVar72._0_8_ = (ulong)(bVar10 & 1) * *(long *)*pauVar31;
                    auVar72._16_8_ = (ulong)((byte)(uVar39 >> 2) & 1) * *(long *)(*pauVar31 + 0x10);
                    auVar72._24_8_ = (ulong)((byte)(uVar39 >> 3) & 1) * *(long *)(*pauVar31 + 0x18);
                    auVar72._32_8_ = (ulong)((byte)(uVar39 >> 4) & 1) * *(long *)(*pauVar31 + 0x20);
                    auVar72._40_8_ = (ulong)((byte)(uVar39 >> 5) & 1) * *(long *)(*pauVar31 + 0x28);
                    auVar72._48_8_ = (ulong)((byte)(uVar39 >> 6) & 1) * *(long *)(*pauVar31 + 0x30);
                    auVar72._56_8_ = (uVar39 >> 7) * *(long *)(*pauVar31 + 0x38);
                    auVar61 = vmulpd_avx512f(auVar61,auVar71);
                    auVar63 = vsubpd_avx512f(auVar72,auVar61);
                    auVar61 = *pauVar31;
                    auVar73._0_8_ =
                         (ulong)(bVar10 & 1) * auVar63._0_8_ |
                         (ulong)!(bool)(bVar10 & 1) * auVar61._0_8_;
                    bVar11 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar73._8_8_ = (ulong)bVar11 * auVar63._8_8_ | (ulong)!bVar11 * auVar61._8_8_;
                    bVar11 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar73._16_8_ =
                         (ulong)bVar11 * auVar63._16_8_ | (ulong)!bVar11 * auVar61._16_8_;
                    bVar11 = (bool)((byte)(uVar39 >> 3) & 1);
                    auVar73._24_8_ =
                         (ulong)bVar11 * auVar63._24_8_ | (ulong)!bVar11 * auVar61._24_8_;
                    bVar11 = (bool)((byte)(uVar39 >> 4) & 1);
                    auVar73._32_8_ =
                         (ulong)bVar11 * auVar63._32_8_ | (ulong)!bVar11 * auVar61._32_8_;
                    bVar11 = (bool)((byte)(uVar39 >> 5) & 1);
                    auVar73._40_8_ =
                         (ulong)bVar11 * auVar63._40_8_ | (ulong)!bVar11 * auVar61._40_8_;
                    bVar11 = (bool)((byte)(uVar39 >> 6) & 1);
                    auVar73._48_8_ =
                         (ulong)bVar11 * auVar63._48_8_ | (ulong)!bVar11 * auVar61._48_8_;
                    auVar73._56_8_ =
                         (uVar39 >> 7) * auVar63._56_8_ |
                         (ulong)!SUB81(uVar39 >> 7,0) * auVar61._56_8_;
                    *pauVar31 = auVar73;
                  }
                  if (uVar37 < 3) {
                    uVar38 = (ulong)(uVar37 << 3);
                    auVar58 = vpbroadcastq_avx512vl();
                    uVar39 = vpcmpuq_avx512vl(auVar58,auVar55,5);
                    uVar39 = uVar39 & 0xf;
                    bVar10 = (byte)uVar39;
                    plVar1 = (long *)(*pauVar31 + uVar38);
                    auVar59._8_8_ = (ulong)((byte)(uVar39 >> 1) & 1) * plVar1[1];
                    auVar59._0_8_ = (ulong)(bVar10 & 1) * *plVar1;
                    auVar59._16_8_ = (ulong)((byte)(uVar39 >> 2) & 1) * plVar1[2];
                    auVar59._24_8_ = (uVar39 >> 3) * plVar1[3];
                    auVar211._0_8_ =
                         (double)((ulong)(bVar10 & 1) *
                                 *(long *)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                 .m_storage.m_data.array + uVar38)) * dVar156;
                    auVar211._8_8_ =
                         (double)((ulong)((byte)(uVar39 >> 1) & 1) *
                                 *(long *)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                 .m_storage.m_data.array + uVar38 + 8)) * dVar156;
                    auVar211._16_8_ =
                         (double)((ulong)((byte)(uVar39 >> 2) & 1) *
                                 *(long *)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                 .m_storage.m_data.array + uVar38 + 0x10)) * dVar156
                    ;
                    auVar211._24_8_ =
                         (double)((uVar39 >> 3) *
                                 *(long *)((long)local_218.super_Matrix<double,_3,_3,_1,_3,_3>.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                 .m_storage.m_data.array + uVar38 + 0x18)) * dVar156
                    ;
                    auVar56 = vsubpd_avx(auVar59,auVar211);
                    auVar58 = *(undefined1 (*) [32])(*pauVar31 + uVar38);
                    auVar60._0_8_ =
                         (ulong)(bVar10 & 1) * auVar56._0_8_ |
                         (ulong)!(bool)(bVar10 & 1) * auVar58._0_8_;
                    bVar11 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar60._8_8_ = (ulong)bVar11 * auVar56._8_8_ | (ulong)!bVar11 * auVar58._8_8_;
                    bVar11 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar60._16_8_ =
                         (ulong)bVar11 * auVar56._16_8_ | (ulong)!bVar11 * auVar58._16_8_;
                    auVar60._24_8_ =
                         (uVar39 >> 3) * auVar56._24_8_ |
                         (ulong)!SUB81(uVar39 >> 3,0) * auVar58._24_8_;
                    *(undefined1 (*) [32])(*pauVar31 + uVar38) = auVar60;
                  }
                  if (lVar33 < lVar45 * 6 + 3) goto LAB_0068cc5a;
                  dVar156 = dVar233 * *(double *)(local_2f8._0_8_ + lVar45 * 8);
                  uVar39 = 3;
                  if (((ulong)pdVar9 & 7) == 0) {
                    uVar37 = -((uint)((ulong)(pdVar9 + lVar45 * 6 + 3) >> 3) & 0x1fffffff) & 7;
                    if ((ulong)uVar37 < 3) {
                      uVar39 = (ulong)uVar37;
                    }
                    if (uVar37 != 0) goto LAB_0068cb9f;
                  }
                  else {
LAB_0068cb9f:
                    uVar38 = 0;
                    do {
                      pdVar43[uVar38] = pdVar43[uVar38] - dVar156 * local_278.m_data[uVar38];
                      uVar38 = uVar38 + 1;
                    } while (uVar39 != uVar38);
                  }
                  if (uVar39 < 3) {
                    do {
                      pdVar43[uVar39] = pdVar43[uVar39] - dVar156 * local_278.m_data[uVar39];
                      uVar39 = uVar39 + 1;
                    } while (uVar39 != 3);
                  }
                  lVar45 = lVar45 + 1;
                  pdVar43 = pdVar43 + 6;
                } while (lVar45 != lVar28 + (ulong)(lVar28 == 0));
              }
              if ((double *)local_2f8._0_8_ != (double *)0x0) {
                free(*(void **)(local_2f8._0_8_ + -8));
              }
              lVar28 = uVar26 + 1;
            } while (lVar28 < this->int_order_b);
          }
        }
      }
      return;
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementBeamIGA::ComputeInternalForces_impl(ChVectorDynamic<>& Fi,
                                                  ChState& state_x,
                                                  ChStateDelta& state_w,
                                                  bool used_for_differentiation) {
    // get two values of absyssa at extreme of span
    double u1 = knots(order);
    double u2 = knots(knots.size() - order - 1);

    double c1 = (u2 - u1) / 2;
    double c2 = (u2 + u1) / 2;

    // zero the Fi accumulator
    Fi.setZero();

    // Do quadrature over the "s" shear Gauss points
    // (only if int_order_b != int_order_s, otherwise do a single loop later over "b" bend points also for shear)

    //***TODO*** maybe not needed: separate bending and shear integration points.

    // Do quadrature over the "b" bend Gauss points

    for (int ig = 0; ig < int_order_b; ++ig) {
        // absyssa in typical -1,+1 range:
        double eta = ChQuadrature::GetStaticTables()->Lroots[int_order_b - 1][ig];
        // absyssa in span range:
        double u = (c1 * eta + c2);
        // scaling = gauss weight
        double w = ChQuadrature::GetStaticTables()->Weight[int_order_b - 1][ig];

        // Jacobian Jsu = ds/du
        double Jsu = this->Jacobian_b[ig];
        // Jacobian Jue = du/deta
        double Jue = c1;

        // compute the basis functions N(u) at given u:
        int nspan = order;

        ChMatrixDynamic<> N(2, (int)nodes.size());  // row n.0 contains N, row n.1 contains dN/du

        geometry::ChBasisToolsBspline::BasisEvaluateDeriv(this->order, nspan, u, knots,
                                                          N);  ///< here return N and dN/du

        // interpolate rotation of section at given u, to compute R.
        // Note: this is approximate.
        // A more precise method: use quaternion splines, as in Kim,Kim and Shin, 1995 paper.
        ChQuaternion<> q_delta;
        ChVector<> da = VNULL;
        ChVector<> delta_rot_dir;
        double delta_rot_angle;
        for (int i = 0; i < nodes.size(); ++i) {
            ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
            q_delta = nodes[0]->coord.rot.GetConjugate() * q_i;
            q_delta.Q_to_AngAxis(delta_rot_angle,
                                 delta_rot_dir);  // a_i = dir_i*angle_i (in spline local reference, -PI..+PI)
            da += delta_rot_dir * delta_rot_angle * N(0, i);  // a = N_i*a_i
        }
        ChQuaternion<> qda;
        qda.Q_from_Rotv(da);
        ChQuaternion<> qR = nodes[0]->coord.rot * qda;

        // compute the 3x3 rotation matrix R equivalent to quaternion above
        ChMatrix33<> R(qR);

        // compute abs. spline gradient r'  = dr/ds
        ChVector<> dr;
        for (int i = 0; i < nodes.size(); ++i) {
            ChVector<> r_i(state_x.segment(i * 7, 3));
            dr += r_i * N(1, i);  // dr/du = N_i'*r_i
        }
        // (note r'= dr/ds = dr/du du/ds = dr/du * 1/Jsu   where Jsu computed in SetupInitial)
        dr *= 1.0 / Jsu;

        // compute abs. time rate of spline gradient  dr'/dt
        ChVector<> drdt;
        for (int i = 0; i < nodes.size(); ++i) {
            ChVector<> drdt_i(state_w.segment(i * 6, 3));
            drdt += drdt_i * N(1, i);
        }
        drdt *= 1.0 / Jsu;

        // compute abs spline rotation gradient q' = dq/ds
        // But.. easier to compute local gradient of spin vector a' = da/ds
        da = VNULL;
        for (int i = 0; i < nodes.size(); ++i) {
            ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
            q_delta = qR.GetConjugate() * q_i;
            q_delta.Q_to_AngAxis(delta_rot_angle,
                                 delta_rot_dir);  // a_i = dir_i*angle_i (in spline local reference, -PI..+PI)
            da += delta_rot_dir * delta_rot_angle * N(1, i);  // da/du = N_i'*a_i
        }
        // (note a= da/ds = da/du du/ds = da/du * 1/Jsu   where Jsu computed in SetupInitial)
        da *= 1.0 / Jsu;

        // compute abs rate of spline rotation gradient da'/dt
        ChVector<> dadt;
        for (int i = 0; i < nodes.size(); ++i) {
            ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
            ChVector<> wl_i(state_w.segment(i * 6 + 3, 3));  //  w in node csys
            ChVector<> w_i = q_i.Rotate(wl_i);               // w in absolute csys
            dadt += w_i * N(1, i);
        }
        dadt *= 1.0 / Jsu;

        // compute local epsilon strain:  strain_e= R^t * r' - {1, 0, 0}
        ChVector<> astrain_e = R.transpose() * dr - VECT_X - this->strain_e_0[ig];

        // compute local time rate of strain:  strain_e_dt = R^t * dr'/dt
        ChVector<> astrain_e_dt = R.transpose() * drdt;

        // compute local curvature strain:  strain_k= 2*[F(q*)(+)] * q' = 2*[F(q*)(+)] * N_i'*q_i = R^t * a' = a'_local
        ChVector<> astrain_k = da - this->strain_k_0[ig];

        // compute local time rate of curvature strain:
        ChVector<> astrain_k_dt = R.transpose() * dadt;

        // compute stress n  (local cut forces)
        // compute stress_m  (local cut torque)
        ChVector<> astress_n;
        ChVector<> astress_m;
        ChBeamMaterialInternalData* aplastic_data_old = nullptr;
        ChBeamMaterialInternalData* aplastic_data = nullptr;
        std::vector<std::unique_ptr<ChBeamMaterialInternalData>> foo_plastic_data;
        if (this->section->GetPlasticity()) {
            aplastic_data_old = this->plastic_data_old[ig].get();
            aplastic_data = this->plastic_data[ig].get();
            if (used_for_differentiation) {
                // Avoid updating plastic_data_new if ComputeInternalForces_impl() called for computing
                // stiffness matrix by backward differentiation. Otherwise pollutes the plastic_data integration.
                this->section->GetPlasticity()->CreatePlasticityData(1, foo_plastic_data);
                aplastic_data = foo_plastic_data[0].get();
            }
        }
        this->section->ComputeStress(astress_n, astress_m, astrain_e, astrain_k, aplastic_data, aplastic_data_old);

        if (!used_for_differentiation) {
            this->stress_n[ig] = astress_n;
            this->stress_m[ig] = astress_m;
            this->strain_e[ig] = astrain_e;
            this->strain_k[ig] = astrain_k;
        }

        // add viscous damping
        if (this->section->GetDamping()) {
            ChVector<> n_sp;
            ChVector<> m_sp;
            this->section->GetDamping()->ComputeStress(n_sp, m_sp, astrain_e_dt, astrain_k_dt);
            astress_n += n_sp;
            astress_m += m_sp;
        }

        // compute internal force, in generalized coordinates:

        ChVector<> stress_n_abs = R * astress_n;
        ChVector<> stress_m_abs = R * astress_m;

        for (int i = 0; i < nodes.size(); ++i) {
            // -Force_i = w * Jue * Jsu * Jsu^-1 * N' * R * C * (strain_e - strain_e0)
            //          = w * Jue                * N'         * stress_n_abs
            ChVector<> Force_i = stress_n_abs * N(1, i) * (-w * Jue);
            Fi.segment(i * 6, 3) += Force_i.eigen();

            // -Torque_i =   w * Jue * Jsu * Jsu^-1 * R_i^t * N'               * R * D * (strain_k - strain_k0) +
            //             + w * Jue * Jsu *          R_i^t * N * skew(r')^t   * R * C * (strain_e - strain_e0)
            //           =   w * Jue * R_i^t                * N'               * stress_m_abs +
            //             + w * Jue * Jsu * R_i^t          * N * skew(r')^t   * stress_n_abs
            ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
            ChVector<> Torque_i = q_i.RotateBack(stress_m_abs * N(1, i) * (-w * Jue) -
                                                 Vcross(dr, stress_n_abs) * N(0, i) * (-w * Jue * Jsu));
            Fi.segment(3 + i * 6, 3) += Torque_i.eigen();
        }

        // GetLog() << "     gp n." << ig <<   "  J=" << this->Jacobian[ig] << "   strain_e= " << strain_e << "\n";
        // GetLog() << "                    stress_n= " << stress_n << "\n";
    }

    // Add also inertial quadratic terms: gyroscopic and centrifugal

    if (ChElementBeamIGA::add_gyroscopic_terms == true) {
        if (ChElementBeamIGA::lumped_mass == true) {
            // CASE OF LUMPED MASS - faster
            double node_multiplier = length / (double)nodes.size();
            ChVector<> mFcent_i;
            ChVector<> mTgyro_i;
            for (int i = 0; i < nodes.size(); ++i) {
                this->section->GetInertia()->ComputeQuadraticTerms(mFcent_i, mTgyro_i, state_w.segment(3 + i * 6, 3));
                ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
                Fi.segment(i * 6, 3) -= node_multiplier * q_i.Rotate(mFcent_i).eigen();
                Fi.segment(3 + i * 6, 3) -= node_multiplier * mTgyro_i.eigen();
            }
        } else {
            // CASE OF CONSISTENT MASS
            ChVector<> mFcent_i;
            ChVector<> mTgyro_i;
            // evaluate inertial quadratic forces using same gauss points used for bending
            for (int ig = 0; ig < int_order_b; ++ig) {
                double eta = ChQuadrature::GetStaticTables()->Lroots[int_order_b - 1][ig];
                double u = (c1 * eta + c2);
                double w = ChQuadrature::GetStaticTables()->Weight[int_order_b - 1][ig];

                double Jsu = this->Jacobian_b[ig];
                double Jue = c1;
                int nspan = order;

                ChMatrixDynamic<> N(1, (int)nodes.size());  // row n.0 contains N, row n.1 contains dN/du
                geometry::ChBasisToolsBspline::BasisEvaluateDeriv(this->order, nspan, u, knots,
                                                                  N);  ///< here return N and dN/du

                // interpolate rotation of section at given u, to compute R.
                // Note: this is approximate.
                // A more precise method: use quaternion splines, as in Kim,Kim and Shin, 1995 paper.
                ChQuaternion<> q_delta;
                ChVector<> da = VNULL;
                ChVector<> delta_rot_dir;
                double delta_rot_angle;
                for (int i = 0; i < nodes.size(); ++i) {
                    ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
                    q_delta = nodes[0]->coord.rot.GetConjugate() * q_i;
                    q_delta.Q_to_AngAxis(delta_rot_angle,
                                         delta_rot_dir);  // a_i = dir_i*angle_i (in spline local reference, -PI..+PI)
                    da += delta_rot_dir * delta_rot_angle * N(0, i);  // a = N_i*a_i
                }
                ChQuaternion<> qda;
                qda.Q_from_Rotv(da);
                ChQuaternion<> qR = nodes[0]->coord.rot * qda;

                ChVector<> w_sect;
                for (int i = 0; i < nodes.size(); ++i) {
                    ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
                    ChVector<> wl_i(state_w.segment(i * 6 + 3, 3));  //  w in node csys
                    ChVector<> w_i = q_i.Rotate(wl_i);               // w in absolute csys
                    w_sect += w_i * N(0, i);
                }
                w_sect = qR.RotateBack(w_sect);  // w in sectional csys

                this->section->GetInertia()->ComputeQuadraticTerms(mFcent_i, mTgyro_i, w_sect);

                for (int i = 0; i < nodes.size(); ++i) {
                    Fi.segment(i * 6, 3) -= w * Jsu * Jue * N(0, i) * qR.Rotate(mFcent_i).eigen();
                    Fi.segment(3 + i * 6, 3) -= w * Jsu * Jue * N(0, i) * mTgyro_i.eigen();
                }
            }
        }
    }  // end quadratic inertial force terms
}